

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  uint uVar77;
  ulong uVar78;
  byte bVar79;
  byte bVar80;
  int iVar81;
  long lVar82;
  byte bVar83;
  long lVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar157;
  uint uVar158;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint uVar160;
  uint uVar161;
  uint uVar162;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  uint uVar159;
  uint uVar163;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar164;
  float fVar184;
  float fVar186;
  vint4 bi_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  float fVar185;
  float fVar187;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar183 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar191;
  vint4 bi_1;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar209 [16];
  undefined1 auVar213 [32];
  float fVar214;
  float fVar233;
  float fVar234;
  vint4 bi;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar235;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar261;
  float fVar262;
  vint4 ai_2;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  vint4 ai_1;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar271;
  undefined1 auVar270 [64];
  vint4 ai;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar281 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [64];
  float fVar283;
  float fVar288;
  float fVar289;
  undefined1 auVar284 [16];
  float fVar290;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [64];
  undefined1 auVar291 [16];
  undefined1 auVar292 [64];
  float fVar294;
  undefined1 auVar293 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 (*local_a50) [32];
  ulong local_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_720 [32];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar145 [32];
  undefined1 auVar300 [64];
  
  PVar2 = prim[1];
  uVar85 = (ulong)(byte)PVar2;
  lVar84 = uVar85 * 0x25;
  fVar283 = *(float *)(prim + lVar84 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar84 + 6));
  auVar236._0_4_ = fVar283 * auVar92._0_4_;
  auVar236._4_4_ = fVar283 * auVar92._4_4_;
  auVar236._8_4_ = fVar283 * auVar92._8_4_;
  auVar236._12_4_ = fVar283 * auVar92._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar165._0_4_ = fVar283 * auVar91._0_4_;
  auVar165._4_4_ = fVar283 * auVar91._4_4_;
  auVar165._8_4_ = fVar283 * auVar91._8_4_;
  auVar165._12_4_ = fVar283 * auVar91._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xf + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar85 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1a + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1b + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1c + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar264._4_4_ = auVar165._0_4_;
  auVar264._0_4_ = auVar165._0_4_;
  auVar264._8_4_ = auVar165._0_4_;
  auVar264._12_4_ = auVar165._0_4_;
  auVar98 = vshufps_avx(auVar165,auVar165,0x55);
  auVar99 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar283 = auVar99._0_4_;
  auVar215._0_4_ = fVar283 * auVar94._0_4_;
  fVar184 = auVar99._4_4_;
  auVar215._4_4_ = fVar184 * auVar94._4_4_;
  fVar288 = auVar99._8_4_;
  auVar215._8_4_ = fVar288 * auVar94._8_4_;
  fVar289 = auVar99._12_4_;
  auVar215._12_4_ = fVar289 * auVar94._12_4_;
  auVar192._0_4_ = auVar96._0_4_ * fVar283;
  auVar192._4_4_ = auVar96._4_4_ * fVar184;
  auVar192._8_4_ = auVar96._8_4_ * fVar288;
  auVar192._12_4_ = auVar96._12_4_ * fVar289;
  auVar166._0_4_ = auVar97._0_4_ * fVar283;
  auVar166._4_4_ = auVar97._4_4_ * fVar184;
  auVar166._8_4_ = auVar97._8_4_ * fVar288;
  auVar166._12_4_ = auVar97._12_4_ * fVar289;
  auVar99 = vfmadd231ps_fma(auVar215,auVar98,auVar91);
  auVar102 = vfmadd231ps_fma(auVar192,auVar98,auVar23);
  auVar98 = vfmadd231ps_fma(auVar166,auVar93,auVar98);
  auVar103 = vfmadd231ps_fma(auVar99,auVar264,auVar92);
  auVar102 = vfmadd231ps_fma(auVar102,auVar264,auVar95);
  auVar100 = vfmadd231ps_fma(auVar98,auVar101,auVar264);
  auVar302._4_4_ = auVar236._0_4_;
  auVar302._0_4_ = auVar236._0_4_;
  auVar302._8_4_ = auVar236._0_4_;
  auVar302._12_4_ = auVar236._0_4_;
  auVar98 = vshufps_avx(auVar236,auVar236,0x55);
  auVar99 = vshufps_avx(auVar236,auVar236,0xaa);
  fVar283 = auVar99._0_4_;
  auVar265._0_4_ = fVar283 * auVar94._0_4_;
  fVar184 = auVar99._4_4_;
  auVar265._4_4_ = fVar184 * auVar94._4_4_;
  fVar288 = auVar99._8_4_;
  auVar265._8_4_ = fVar288 * auVar94._8_4_;
  fVar289 = auVar99._12_4_;
  auVar265._12_4_ = fVar289 * auVar94._12_4_;
  auVar256._0_4_ = auVar96._0_4_ * fVar283;
  auVar256._4_4_ = auVar96._4_4_ * fVar184;
  auVar256._8_4_ = auVar96._8_4_ * fVar288;
  auVar256._12_4_ = auVar96._12_4_ * fVar289;
  auVar237._0_4_ = auVar97._0_4_ * fVar283;
  auVar237._4_4_ = auVar97._4_4_ * fVar184;
  auVar237._8_4_ = auVar97._8_4_ * fVar288;
  auVar237._12_4_ = auVar97._12_4_ * fVar289;
  auVar91 = vfmadd231ps_fma(auVar265,auVar98,auVar91);
  auVar94 = vfmadd231ps_fma(auVar256,auVar98,auVar23);
  auVar23 = vfmadd231ps_fma(auVar237,auVar98,auVar93);
  auVar291 = vfmadd231ps_fma(auVar91,auVar302,auVar92);
  auVar165 = vfmadd231ps_fma(auVar94,auVar302,auVar95);
  auVar284._8_4_ = 0x7fffffff;
  auVar284._0_8_ = 0x7fffffff7fffffff;
  auVar284._12_4_ = 0x7fffffff;
  auVar166 = vfmadd231ps_fma(auVar23,auVar302,auVar101);
  auVar92 = vandps_avx(auVar284,auVar103);
  auVar277._8_4_ = 0x219392ef;
  auVar277._0_8_ = 0x219392ef219392ef;
  auVar277._12_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar92,auVar277,1);
  bVar9 = (bool)((byte)uVar78 & 1);
  auVar88._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._0_4_;
  bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._4_4_;
  bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._8_4_;
  bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._12_4_;
  auVar92 = vandps_avx(auVar284,auVar102);
  uVar78 = vcmpps_avx512vl(auVar92,auVar277,1);
  bVar9 = (bool)((byte)uVar78 & 1);
  auVar89._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._0_4_;
  bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._4_4_;
  bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._8_4_;
  bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._12_4_;
  auVar92 = vandps_avx(auVar284,auVar100);
  uVar78 = vcmpps_avx512vl(auVar92,auVar277,1);
  bVar9 = (bool)((byte)uVar78 & 1);
  auVar90._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar100._0_4_;
  bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar100._4_4_;
  bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar100._8_4_;
  bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar100._12_4_;
  auVar91 = vrcp14ps_avx512vl(auVar88);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = 0x3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar88,auVar91,auVar278);
  auVar103 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vfnmadd213ps_fma(auVar89,auVar91,auVar278);
  auVar100 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar90);
  auVar92 = vfnmadd213ps_fma(auVar90,auVar91,auVar278);
  auVar104 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  fVar283 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar84 + 0x16)) *
            *(float *)(prim + lVar84 + 0x1a);
  auVar272._4_4_ = fVar283;
  auVar272._0_4_ = fVar283;
  auVar272._8_4_ = fVar283;
  auVar272._12_4_ = fVar283;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar91 = vpmovsxwd_avx(auVar91);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar95 = vsubps_avx(auVar91,auVar92);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar91 = vpmovsxwd_avx(auVar94);
  auVar94 = vfmadd213ps_fma(auVar95,auVar272,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar91);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 6);
  auVar91 = vpmovsxwd_avx(auVar95);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar95 = vfmadd213ps_fma(auVar91,auVar272,auVar92);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 6);
  auVar92 = vpmovsxwd_avx(auVar23);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar78 = (ulong)(uint)((int)(uVar85 * 5) << 2);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar85 * 2 + uVar78 + 6);
  auVar91 = vpmovsxwd_avx(auVar96);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar23 = vfmadd213ps_fma(auVar91,auVar272,auVar92);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar92 = vpmovsxwd_avx(auVar101);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar85 * 0x18 + 6);
  auVar91 = vpmovsxwd_avx(auVar93);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar96 = vfmadd213ps_fma(auVar91,auVar272,auVar92);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar85 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar97);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar85 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar91 = vpmovsxwd_avx(auVar98);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar101 = vfmadd213ps_fma(auVar91,auVar272,auVar92);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar85) + 6);
  auVar92 = vpmovsxwd_avx(auVar99);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar85 * 0x23 + 6);
  auVar91 = vpmovsxwd_avx(auVar102);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar91 = vfmadd213ps_fma(auVar91,auVar272,auVar92);
  auVar92 = vsubps_avx(auVar94,auVar291);
  auVar273._0_4_ = auVar103._0_4_ * auVar92._0_4_;
  auVar273._4_4_ = auVar103._4_4_ * auVar92._4_4_;
  auVar273._8_4_ = auVar103._8_4_ * auVar92._8_4_;
  auVar273._12_4_ = auVar103._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar95,auVar291);
  auVar216._0_4_ = auVar103._0_4_ * auVar92._0_4_;
  auVar216._4_4_ = auVar103._4_4_ * auVar92._4_4_;
  auVar216._8_4_ = auVar103._8_4_ * auVar92._8_4_;
  auVar216._12_4_ = auVar103._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar23,auVar165);
  auVar266._0_4_ = auVar100._0_4_ * auVar92._0_4_;
  auVar266._4_4_ = auVar100._4_4_ * auVar92._4_4_;
  auVar266._8_4_ = auVar100._8_4_ * auVar92._8_4_;
  auVar266._12_4_ = auVar100._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar96,auVar165);
  auVar193._0_4_ = auVar100._0_4_ * auVar92._0_4_;
  auVar193._4_4_ = auVar100._4_4_ * auVar92._4_4_;
  auVar193._8_4_ = auVar100._8_4_ * auVar92._8_4_;
  auVar193._12_4_ = auVar100._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar101,auVar166);
  auVar257._0_4_ = auVar104._0_4_ * auVar92._0_4_;
  auVar257._4_4_ = auVar104._4_4_ * auVar92._4_4_;
  auVar257._8_4_ = auVar104._8_4_ * auVar92._8_4_;
  auVar257._12_4_ = auVar104._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar91,auVar166);
  auVar167._0_4_ = auVar104._0_4_ * auVar92._0_4_;
  auVar167._4_4_ = auVar104._4_4_ * auVar92._4_4_;
  auVar167._8_4_ = auVar104._8_4_ * auVar92._8_4_;
  auVar167._12_4_ = auVar104._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar273,auVar216);
  auVar91 = vpminsd_avx(auVar266,auVar193);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91 = vpminsd_avx(auVar257,auVar167);
  uVar191 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar103._4_4_ = uVar191;
  auVar103._0_4_ = uVar191;
  auVar103._8_4_ = uVar191;
  auVar103._12_4_ = uVar191;
  auVar91 = vmaxps_avx512vl(auVar91,auVar103);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar100._8_4_ = 0x3f7ffffa;
  auVar100._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar100._12_4_ = 0x3f7ffffa;
  local_6e0 = vmulps_avx512vl(auVar92,auVar100);
  auVar92 = vpmaxsd_avx(auVar273,auVar216);
  auVar91 = vpmaxsd_avx(auVar266,auVar193);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar91 = vpmaxsd_avx(auVar257,auVar167);
  uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar104._4_4_ = uVar191;
  auVar104._0_4_ = uVar191;
  auVar104._8_4_ = uVar191;
  auVar104._12_4_ = uVar191;
  auVar91 = vminps_avx512vl(auVar91,auVar104);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar291._8_4_ = 0x3f800003;
  auVar291._0_8_ = 0x3f8000033f800003;
  auVar291._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar291);
  auVar91 = vpbroadcastd_avx512vl();
  uVar24 = vcmpps_avx512vl(local_6e0,auVar92,2);
  local_8e8 = vpcmpgtd_avx512vl(auVar91,_DAT_01f7fcf0);
  local_8e8 = ((byte)uVar24 & 0xf) & local_8e8;
  if ((char)local_8e8 == '\0') {
    return;
  }
  local_a50 = (undefined1 (*) [32])local_240;
  auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar183);
  local_8f0 = prim;
LAB_01baa103:
  lVar84 = 0;
  for (uVar78 = local_8e8; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar84 = lVar84 + 1;
  }
  uVar77 = *(uint *)(local_8f0 + 2);
  local_a48 = (ulong)*(uint *)(local_8f0 + lVar84 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar77].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           local_a48 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar283 = (pGVar3->time_range).lower;
  fVar283 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar283) / ((pGVar3->time_range).upper - fVar283));
  auVar92 = vroundss_avx(ZEXT416((uint)fVar283),ZEXT416((uint)fVar283),9);
  auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar92 = vmaxss_avx(ZEXT816(0) << 0x20,auVar92);
  fVar283 = fVar283 - auVar92._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar82 = (long)(int)auVar92._0_4_ * 0x38;
  lVar84 = *(long *)(_Var4 + 0x10 + lVar82);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar82);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar82);
  pfVar1 = (float *)(lVar5 + uVar78 * lVar6);
  auVar217._0_4_ = fVar283 * *pfVar1;
  auVar217._4_4_ = fVar283 * pfVar1[1];
  auVar217._8_4_ = fVar283 * pfVar1[2];
  auVar217._12_4_ = fVar283 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar78 + 1) * lVar6);
  auVar238._0_4_ = fVar283 * *pfVar1;
  auVar238._4_4_ = fVar283 * pfVar1[1];
  auVar238._8_4_ = fVar283 * pfVar1[2];
  auVar238._12_4_ = fVar283 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar78 + 2) * lVar6);
  auVar258._0_4_ = fVar283 * *pfVar1;
  auVar258._4_4_ = fVar283 * pfVar1[1];
  auVar258._8_4_ = fVar283 * pfVar1[2];
  auVar258._12_4_ = fVar283 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar78 + 3));
  auVar194._0_4_ = fVar283 * *pfVar1;
  auVar194._4_4_ = fVar283 * pfVar1[1];
  auVar194._8_4_ = fVar283 * pfVar1[2];
  auVar194._12_4_ = fVar283 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar82);
  fVar283 = 1.0 - fVar283;
  auVar168._4_4_ = fVar283;
  auVar168._0_4_ = fVar283;
  auVar168._8_4_ = fVar283;
  auVar168._12_4_ = fVar283;
  auVar94 = vfmadd231ps_fma(auVar217,auVar168,*(undefined1 (*) [16])(lVar5 + lVar84 * uVar78));
  auVar95 = vfmadd231ps_fma(auVar238,auVar168,*(undefined1 (*) [16])(lVar5 + lVar84 * (uVar78 + 1)))
  ;
  auVar23 = vfmadd231ps_fma(auVar258,auVar168,*(undefined1 (*) [16])(lVar5 + lVar84 * (uVar78 + 2)))
  ;
  auVar96 = vfmadd231ps_fma(auVar194,auVar168,*(undefined1 (*) [16])(lVar5 + lVar84 * (uVar78 + 3)))
  ;
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar91 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar191 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar296._4_4_ = uVar191;
  auVar296._0_4_ = uVar191;
  auVar296._8_4_ = uVar191;
  auVar296._12_4_ = uVar191;
  fStack_7d0 = (float)uVar191;
  _local_7e0 = auVar296;
  fStack_7cc = (float)uVar191;
  fStack_7c8 = (float)uVar191;
  register0x0000151c = uVar191;
  auVar300 = ZEXT3264(_local_7e0);
  uVar191 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar301._4_4_ = uVar191;
  auVar301._0_4_ = uVar191;
  auVar301._8_4_ = uVar191;
  auVar301._12_4_ = uVar191;
  local_800._16_4_ = uVar191;
  local_800._0_16_ = auVar301;
  local_800._20_4_ = uVar191;
  local_800._24_4_ = uVar191;
  local_800._28_4_ = uVar191;
  auVar92 = vunpcklps_avx(auVar296,auVar301);
  fVar283 = *(float *)(ray + k * 4 + 0x180);
  auVar303._4_4_ = fVar283;
  auVar303._0_4_ = fVar283;
  auVar303._8_4_ = fVar283;
  auVar303._12_4_ = fVar283;
  local_820._16_4_ = fVar283;
  local_820._0_16_ = auVar303;
  local_820._20_4_ = fVar283;
  local_820._24_4_ = fVar283;
  local_820._28_4_ = fVar283;
  local_a10 = vinsertps_avx(auVar92,auVar303,0x28);
  auVar292 = ZEXT1664(local_a10);
  auVar267._0_4_ = auVar94._0_4_ + auVar95._0_4_ + auVar23._0_4_ + auVar96._0_4_;
  auVar267._4_4_ = auVar94._4_4_ + auVar95._4_4_ + auVar23._4_4_ + auVar96._4_4_;
  auVar267._8_4_ = auVar94._8_4_ + auVar95._8_4_ + auVar23._8_4_ + auVar96._8_4_;
  auVar267._12_4_ = auVar94._12_4_ + auVar95._12_4_ + auVar23._12_4_ + auVar96._12_4_;
  auVar29._8_4_ = 0x3e800000;
  auVar29._0_8_ = 0x3e8000003e800000;
  auVar29._12_4_ = 0x3e800000;
  auVar92 = vmulps_avx512vl(auVar267,auVar29);
  auVar92 = vsubps_avx(auVar92,auVar91);
  auVar92 = vdpps_avx(auVar92,local_a10,0x7f);
  fVar184 = *(float *)(ray + k * 4 + 0xc0);
  auVar293 = ZEXT464((uint)fVar184);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar295 = ZEXT1664(local_a20);
  auVar97 = ZEXT816(0) << 0x40;
  auVar287 = ZEXT1664(auVar97);
  auVar274._4_12_ = ZEXT812(0) << 0x20;
  auVar274._0_4_ = local_a20._0_4_;
  auVar93 = vrcp14ss_avx512f(auVar97,auVar274);
  auVar101 = vfnmadd213ss_fma(auVar93,local_a20,ZEXT416(0x40000000));
  local_620 = auVar92._0_4_ * auVar93._0_4_ * auVar101._0_4_;
  auVar270 = ZEXT464((uint)local_620);
  auVar275._4_4_ = local_620;
  auVar275._0_4_ = local_620;
  auVar275._8_4_ = local_620;
  auVar275._12_4_ = local_620;
  fStack_9f0 = local_620;
  _local_a00 = auVar275;
  fStack_9ec = local_620;
  fStack_9e8 = local_620;
  fStack_9e4 = local_620;
  auVar92 = vfmadd231ps_fma(auVar91,local_a10,auVar275);
  auVar92 = vblendps_avx(auVar92,auVar97,8);
  auVar91 = vsubps_avx(auVar94,auVar92);
  auVar94 = vsubps_avx(auVar23,auVar92);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar92 = vsubps_avx(auVar96,auVar92);
  auVar282 = ZEXT1664(auVar92);
  auVar105 = vbroadcastss_avx512vl(auVar91);
  auVar112._8_4_ = 1;
  auVar112._0_8_ = 0x100000001;
  auVar112._12_4_ = 1;
  auVar112._16_4_ = 1;
  auVar112._20_4_ = 1;
  auVar112._24_4_ = 1;
  auVar112._28_4_ = 1;
  local_980 = ZEXT1632(auVar91);
  auVar106 = vpermps_avx512vl(auVar112,local_980);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  auVar107 = vpermps_avx512vl(auVar113,local_980);
  auVar116._8_4_ = 3;
  auVar116._0_8_ = 0x300000003;
  auVar116._12_4_ = 3;
  auVar116._16_4_ = 3;
  auVar116._20_4_ = 3;
  auVar116._24_4_ = 3;
  auVar116._28_4_ = 3;
  local_ae0 = vpermps_avx512vl(auVar116,local_980);
  auVar304 = ZEXT3264(local_ae0);
  local_b00 = vbroadcastss_avx512vl(auVar95);
  auVar305 = ZEXT3264(local_b00);
  local_9c0 = ZEXT1632(auVar95);
  auVar108 = vpermps_avx512vl(auVar112,local_9c0);
  local_b20 = vpermps_avx512vl(auVar113,local_9c0);
  auVar306 = ZEXT3264(local_b20);
  auVar109 = vpermps_avx512vl(auVar116,local_9c0);
  auVar110 = vbroadcastss_avx512vl(auVar94);
  local_9a0 = ZEXT1632(auVar94);
  local_b40 = vpermps_avx512vl(auVar112,local_9a0);
  auVar307 = ZEXT3264(local_b40);
  local_b60 = vpermps_avx512vl(auVar113,local_9a0);
  auVar308 = ZEXT3264(local_b60);
  auVar111 = vpermps_avx512vl(auVar116,local_9a0);
  local_5a0 = vbroadcastss_avx512vl(auVar92);
  _local_9e0 = ZEXT1632(auVar92);
  local_5c0 = vpermps_avx2(auVar112,_local_9e0);
  local_580 = vpermps_avx512vl(auVar113,_local_9e0);
  local_600 = vpermps_avx2(auVar116,_local_9e0);
  auVar92 = vfmadd231ps_fma(ZEXT432((uint)(fVar283 * fVar283)),local_800,local_800);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),_local_7e0,_local_7e0);
  local_560._0_4_ = auVar92._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar115);
  local_950 = ZEXT416((uint)local_620);
  local_620 = fVar184 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar183 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar183);
  uVar78 = 0;
  iVar81 = 1;
  auVar183 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar183);
  auVar92 = vsqrtss_avx(local_a20,local_a20);
  auVar91 = vsqrtss_avx(local_a20,local_a20);
  auVar183 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_5e0 = local_580;
  do {
    local_6d0 = auVar183._0_16_;
    auVar94 = vmovshdup_avx(local_6d0);
    auVar94 = vsubps_avx(auVar94,local_6d0);
    auVar174._0_4_ = auVar94._0_4_;
    fVar263 = auVar174._0_4_ * 0.04761905;
    uVar191 = auVar183._0_4_;
    local_a80._4_4_ = uVar191;
    local_a80._0_4_ = uVar191;
    local_a80._8_4_ = uVar191;
    local_a80._12_4_ = uVar191;
    local_a80._16_4_ = uVar191;
    local_a80._20_4_ = uVar191;
    local_a80._24_4_ = uVar191;
    local_a80._28_4_ = uVar191;
    auVar174._4_4_ = auVar174._0_4_;
    auVar174._8_4_ = auVar174._0_4_;
    auVar174._12_4_ = auVar174._0_4_;
    auVar174._16_4_ = auVar174._0_4_;
    auVar174._20_4_ = auVar174._0_4_;
    auVar174._24_4_ = auVar174._0_4_;
    auVar174._28_4_ = auVar174._0_4_;
    auVar94 = vfmadd231ps_fma(local_a80,auVar174,_DAT_01faff20);
    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar113 = vsubps_avx512vl(auVar112,ZEXT1632(auVar94));
    fVar283 = auVar113._0_4_;
    fVar289 = auVar113._4_4_;
    fVar251 = auVar113._8_4_;
    fVar253 = auVar113._12_4_;
    fVar255 = auVar113._16_4_;
    fVar261 = auVar113._20_4_;
    fVar262 = auVar113._24_4_;
    fVar164 = fVar283 * fVar283 * fVar283;
    fVar185 = fVar289 * fVar289 * fVar289;
    auVar117._4_4_ = fVar185;
    auVar117._0_4_ = fVar164;
    fVar186 = fVar251 * fVar251 * fVar251;
    auVar117._8_4_ = fVar186;
    fVar187 = fVar253 * fVar253 * fVar253;
    auVar117._12_4_ = fVar187;
    fVar188 = fVar255 * fVar255 * fVar255;
    auVar117._16_4_ = fVar188;
    fVar189 = fVar261 * fVar261 * fVar261;
    auVar117._20_4_ = fVar189;
    fVar190 = fVar262 * fVar262 * fVar262;
    auVar117._24_4_ = fVar190;
    auVar117._28_4_ = auVar174._0_4_;
    auVar114 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar115 = vmulps_avx512vl(auVar117,auVar114);
    fVar288 = auVar94._0_4_;
    fVar290 = auVar94._4_4_;
    fVar252 = auVar94._8_4_;
    fVar254 = auVar94._12_4_;
    fVar214 = fVar288 * fVar288 * fVar288;
    fVar233 = fVar290 * fVar290 * fVar290;
    fVar234 = fVar252 * fVar252 * fVar252;
    fVar235 = fVar254 * fVar254 * fVar254;
    auVar137._28_4_ = DAT_01faff20._28_4_;
    auVar137._0_28_ = ZEXT1628(CONCAT412(fVar235,CONCAT48(fVar234,CONCAT44(fVar233,fVar214))));
    auVar183._0_4_ = fVar288 * fVar283;
    auVar183._4_4_ = fVar290 * fVar289;
    auVar183._8_4_ = fVar252 * fVar251;
    auVar183._12_4_ = fVar254 * fVar253;
    auVar183._16_4_ = fVar255 * 0.0;
    auVar183._20_4_ = fVar261 * 0.0;
    auVar183._28_36_ = auVar292._28_36_;
    auVar183._24_4_ = fVar262 * 0.0;
    auVar116 = vmulps_avx512vl(auVar137,auVar114);
    fVar294 = auVar116._28_4_ + auVar174._0_4_;
    fVar271 = fVar294 + auVar295._28_4_ + auVar270._28_4_;
    auVar122._4_4_ = fVar185 * 0.16666667;
    auVar122._0_4_ = fVar164 * 0.16666667;
    auVar122._8_4_ = fVar186 * 0.16666667;
    auVar122._12_4_ = fVar187 * 0.16666667;
    auVar122._16_4_ = fVar188 * 0.16666667;
    auVar122._20_4_ = fVar189 * 0.16666667;
    auVar122._24_4_ = fVar190 * 0.16666667;
    auVar122._28_4_ = fVar294;
    auVar119._4_4_ =
         (auVar183._4_4_ * fVar289 * 12.0 + auVar183._4_4_ * fVar290 * 6.0 +
         fVar233 + auVar115._4_4_) * 0.16666667;
    auVar119._0_4_ =
         (auVar183._0_4_ * fVar283 * 12.0 + auVar183._0_4_ * fVar288 * 6.0 +
         fVar214 + auVar115._0_4_) * 0.16666667;
    auVar119._8_4_ =
         (auVar183._8_4_ * fVar251 * 12.0 + auVar183._8_4_ * fVar252 * 6.0 +
         fVar234 + auVar115._8_4_) * 0.16666667;
    auVar119._12_4_ =
         (auVar183._12_4_ * fVar253 * 12.0 + auVar183._12_4_ * fVar254 * 6.0 +
         fVar235 + auVar115._12_4_) * 0.16666667;
    auVar119._16_4_ =
         (auVar183._16_4_ * fVar255 * 12.0 + auVar183._16_4_ * 0.0 * 6.0 + auVar115._16_4_ + 0.0) *
         0.16666667;
    auVar119._20_4_ =
         (auVar183._20_4_ * fVar261 * 12.0 + auVar183._20_4_ * 0.0 * 6.0 + auVar115._20_4_ + 0.0) *
         0.16666667;
    auVar119._24_4_ =
         (auVar183._24_4_ * fVar262 * 12.0 + auVar183._24_4_ * 0.0 * 6.0 + auVar115._24_4_ + 0.0) *
         0.16666667;
    auVar119._28_4_ = auVar295._28_4_;
    auVar120._4_4_ =
         (auVar116._4_4_ + fVar185 +
         auVar183._4_4_ * fVar290 * 12.0 + auVar183._4_4_ * fVar289 * 6.0) * 0.16666667;
    auVar120._0_4_ =
         (auVar116._0_4_ + fVar164 +
         auVar183._0_4_ * fVar288 * 12.0 + auVar183._0_4_ * fVar283 * 6.0) * 0.16666667;
    auVar120._8_4_ =
         (auVar116._8_4_ + fVar186 +
         auVar183._8_4_ * fVar252 * 12.0 + auVar183._8_4_ * fVar251 * 6.0) * 0.16666667;
    auVar120._12_4_ =
         (auVar116._12_4_ + fVar187 +
         auVar183._12_4_ * fVar254 * 12.0 + auVar183._12_4_ * fVar253 * 6.0) * 0.16666667;
    auVar120._16_4_ =
         (auVar116._16_4_ + fVar188 + auVar183._16_4_ * 0.0 * 12.0 + auVar183._16_4_ * fVar255 * 6.0
         ) * 0.16666667;
    auVar120._20_4_ =
         (auVar116._20_4_ + fVar189 + auVar183._20_4_ * 0.0 * 12.0 + auVar183._20_4_ * fVar261 * 6.0
         ) * 0.16666667;
    auVar120._24_4_ =
         (auVar116._24_4_ + fVar190 + auVar183._24_4_ * 0.0 * 12.0 + auVar183._24_4_ * fVar262 * 6.0
         ) * 0.16666667;
    auVar120._28_4_ = auVar300._28_4_;
    fVar214 = fVar214 * 0.16666667;
    fVar233 = fVar233 * 0.16666667;
    fVar234 = fVar234 * 0.16666667;
    fVar235 = fVar235 * 0.16666667;
    auVar121._28_4_ = fVar271;
    auVar121._0_28_ = ZEXT1628(CONCAT412(fVar235,CONCAT48(fVar234,CONCAT44(fVar233,fVar214))));
    auVar116 = vmulps_avx512vl(local_5a0,auVar121);
    auVar124._4_4_ = local_5c0._4_4_ * fVar233;
    auVar124._0_4_ = local_5c0._0_4_ * fVar214;
    auVar124._8_4_ = local_5c0._8_4_ * fVar234;
    auVar124._12_4_ = local_5c0._12_4_ * fVar235;
    auVar124._16_4_ = local_5c0._16_4_ * 0.0;
    auVar124._20_4_ = local_5c0._20_4_ * 0.0;
    auVar124._24_4_ = local_5c0._24_4_ * 0.0;
    auVar124._28_4_ = auVar293._28_4_ + auVar300._28_4_ + DAT_01faff20._28_4_ + auVar115._28_4_;
    auVar115 = vmulps_avx512vl(local_5e0,auVar121);
    auVar125._4_4_ = local_600._4_4_ * fVar233;
    auVar125._0_4_ = local_600._0_4_ * fVar214;
    auVar125._8_4_ = local_600._8_4_ * fVar234;
    auVar125._12_4_ = local_600._12_4_ * fVar235;
    auVar125._16_4_ = local_600._16_4_ * 0.0;
    auVar125._20_4_ = local_600._20_4_ * 0.0;
    auVar125._24_4_ = local_600._24_4_ * 0.0;
    auVar125._28_4_ = fVar271;
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,auVar110);
    auVar117 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar307._0_32_);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar120,auVar308._0_32_);
    auVar118 = vfmadd231ps_avx512vl(auVar125,auVar111,auVar120);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar119,auVar305._0_32_);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,auVar108);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,auVar306._0_32_);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,auVar119);
    auVar119 = vfmadd231ps_avx512vl(auVar116,auVar122,auVar105);
    auVar120 = vfmadd231ps_avx512vl(auVar117,auVar122,auVar106);
    auVar121 = vfmadd231ps_avx512vl(auVar115,auVar122,auVar107);
    auVar116 = vfmadd231ps_avx512vl(auVar118,auVar304._0_32_,auVar122);
    auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar117 = vxorps_avx512vl(auVar113,auVar122);
    auVar118 = vxorps_avx512vl(ZEXT1632(auVar94),auVar122);
    auVar138._0_4_ = auVar118._0_4_ * fVar288;
    auVar138._4_4_ = auVar118._4_4_ * fVar290;
    auVar138._8_4_ = auVar118._8_4_ * fVar252;
    auVar138._12_4_ = auVar118._12_4_ * fVar254;
    auVar138._16_4_ = auVar118._16_4_ * 0.0;
    auVar138._20_4_ = auVar118._20_4_ * 0.0;
    auVar138._24_4_ = auVar118._24_4_ * 0.0;
    auVar138._28_4_ = 0;
    auVar123 = vmulps_avx512vl(auVar183._0_32_,auVar114);
    auVar115 = vsubps_avx(auVar138,auVar123);
    auVar126._4_4_ = auVar117._4_4_ * fVar289 * 0.5;
    auVar126._0_4_ = auVar117._0_4_ * fVar283 * 0.5;
    auVar126._8_4_ = auVar117._8_4_ * fVar251 * 0.5;
    auVar126._12_4_ = auVar117._12_4_ * fVar253 * 0.5;
    auVar126._16_4_ = auVar117._16_4_ * fVar255 * 0.5;
    auVar126._20_4_ = auVar117._20_4_ * fVar261 * 0.5;
    auVar126._24_4_ = auVar117._24_4_ * fVar262 * 0.5;
    auVar126._28_4_ = auVar113._28_4_;
    auVar127._4_4_ = auVar115._4_4_ * 0.5;
    auVar127._0_4_ = auVar115._0_4_ * 0.5;
    auVar127._8_4_ = auVar115._8_4_ * 0.5;
    auVar127._12_4_ = auVar115._12_4_ * 0.5;
    auVar127._16_4_ = auVar115._16_4_ * 0.5;
    auVar127._20_4_ = auVar115._20_4_ * 0.5;
    auVar127._24_4_ = auVar115._24_4_ * 0.5;
    auVar127._28_4_ = auVar115._28_4_;
    auVar128._4_4_ = (auVar123._4_4_ + fVar289 * fVar289) * 0.5;
    auVar128._0_4_ = (auVar123._0_4_ + fVar283 * fVar283) * 0.5;
    auVar128._8_4_ = (auVar123._8_4_ + fVar251 * fVar251) * 0.5;
    auVar128._12_4_ = (auVar123._12_4_ + fVar253 * fVar253) * 0.5;
    auVar128._16_4_ = (auVar123._16_4_ + fVar255 * fVar255) * 0.5;
    auVar128._20_4_ = (auVar123._20_4_ + fVar261 * fVar261) * 0.5;
    auVar128._24_4_ = (auVar123._24_4_ + fVar262 * fVar262) * 0.5;
    auVar128._28_4_ = auVar123._28_4_ + auVar282._28_4_;
    fVar283 = fVar288 * fVar288 * 0.5;
    fVar288 = fVar290 * fVar290 * 0.5;
    fVar289 = fVar252 * fVar252 * 0.5;
    fVar290 = fVar254 * fVar254 * 0.5;
    auVar129._28_4_ = auVar287._28_4_;
    auVar129._0_28_ = ZEXT1628(CONCAT412(fVar290,CONCAT48(fVar289,CONCAT44(fVar288,fVar283))));
    auVar115 = vmulps_avx512vl(local_5a0,auVar129);
    auVar133._4_4_ = local_5c0._4_4_ * fVar288;
    auVar133._0_4_ = local_5c0._0_4_ * fVar283;
    auVar133._8_4_ = local_5c0._8_4_ * fVar289;
    auVar133._12_4_ = local_5c0._12_4_ * fVar290;
    auVar133._16_4_ = local_5c0._16_4_ * 0.0;
    auVar133._20_4_ = local_5c0._20_4_ * 0.0;
    auVar133._24_4_ = local_5c0._24_4_ * 0.0;
    auVar133._28_4_ = auVar118._28_4_;
    auVar113 = vmulps_avx512vl(local_5e0,auVar129);
    auVar134._4_4_ = fVar288 * local_600._4_4_;
    auVar134._0_4_ = fVar283 * local_600._0_4_;
    auVar134._8_4_ = fVar289 * local_600._8_4_;
    auVar134._12_4_ = fVar290 * local_600._12_4_;
    auVar134._16_4_ = local_600._16_4_ * 0.0;
    auVar134._20_4_ = local_600._20_4_ * 0.0;
    auVar134._24_4_ = local_600._24_4_ * 0.0;
    auVar134._28_4_ = auVar287._28_4_;
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar128,auVar110);
    auVar117 = vfmadd231ps_avx512vl(auVar133,auVar128,auVar307._0_32_);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar128,auVar308._0_32_);
    auVar94 = vfmadd231ps_fma(auVar134,auVar111,auVar128);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,auVar305._0_32_);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar127,auVar108);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar127,auVar306._0_32_);
    auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar109,auVar127);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar126,auVar105);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar126,auVar106);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar107);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar304._0_32_,auVar126);
    auVar142._4_4_ = auVar115._4_4_ * fVar263;
    auVar142._0_4_ = auVar115._0_4_ * fVar263;
    auVar142._8_4_ = auVar115._8_4_ * fVar263;
    auVar142._12_4_ = auVar115._12_4_ * fVar263;
    auVar142._16_4_ = auVar115._16_4_ * fVar263;
    auVar142._20_4_ = auVar115._20_4_ * fVar263;
    auVar142._24_4_ = auVar115._24_4_ * fVar263;
    auVar142._28_4_ = auVar111._28_4_;
    auVar300 = ZEXT3264(auVar142);
    auVar143._4_4_ = auVar117._4_4_ * fVar263;
    auVar143._0_4_ = auVar117._0_4_ * fVar263;
    auVar143._8_4_ = auVar117._8_4_ * fVar263;
    auVar143._12_4_ = auVar117._12_4_ * fVar263;
    auVar143._16_4_ = auVar117._16_4_ * fVar263;
    auVar143._20_4_ = auVar117._20_4_ * fVar263;
    auVar143._24_4_ = auVar117._24_4_ * fVar263;
    auVar143._28_4_ = 0x3e2aaaab;
    auVar144._4_4_ = auVar113._4_4_ * fVar263;
    auVar144._0_4_ = auVar113._0_4_ * fVar263;
    auVar144._8_4_ = auVar113._8_4_ * fVar263;
    auVar144._12_4_ = auVar113._12_4_ * fVar263;
    auVar144._16_4_ = auVar113._16_4_ * fVar263;
    auVar144._20_4_ = auVar113._20_4_ * fVar263;
    auVar144._24_4_ = auVar113._24_4_ * fVar263;
    auVar144._28_4_ = 0x40c00000;
    fVar283 = auVar118._0_4_ * fVar263;
    fVar288 = auVar118._4_4_ * fVar263;
    auVar135._4_4_ = fVar288;
    auVar135._0_4_ = fVar283;
    fVar289 = auVar118._8_4_ * fVar263;
    auVar135._8_4_ = fVar289;
    fVar290 = auVar118._12_4_ * fVar263;
    auVar135._12_4_ = fVar290;
    fVar251 = auVar118._16_4_ * fVar263;
    auVar135._16_4_ = fVar251;
    fVar252 = auVar118._20_4_ * fVar263;
    auVar135._20_4_ = fVar252;
    fVar253 = auVar118._24_4_ * fVar263;
    auVar135._24_4_ = fVar253;
    auVar135._28_4_ = fVar263;
    auVar94 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
    auVar124 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,ZEXT1632(auVar94));
    auVar292 = ZEXT3264(auVar124);
    auVar125 = vpermt2ps_avx512vl(auVar120,_DAT_01feed00,ZEXT1632(auVar94));
    auVar293 = ZEXT3264(auVar125);
    auVar113 = ZEXT1632(auVar94);
    auVar126 = vpermt2ps_avx512vl(auVar121,_DAT_01feed00,auVar113);
    auVar295 = ZEXT3264(auVar126);
    auVar139._0_4_ = fVar283 + auVar116._0_4_;
    auVar139._4_4_ = fVar288 + auVar116._4_4_;
    auVar139._8_4_ = fVar289 + auVar116._8_4_;
    auVar139._12_4_ = fVar290 + auVar116._12_4_;
    auVar139._16_4_ = fVar251 + auVar116._16_4_;
    auVar139._20_4_ = fVar252 + auVar116._20_4_;
    auVar139._24_4_ = fVar253 + auVar116._24_4_;
    auVar139._28_4_ = fVar263 + auVar116._28_4_;
    auVar115 = vmaxps_avx(auVar116,auVar139);
    auVar112 = vminps_avx(auVar116,auVar139);
    auVar123 = vpermt2ps_avx512vl(auVar116,_DAT_01feed00,auVar113);
    auVar127 = vpermt2ps_avx512vl(auVar142,_DAT_01feed00,auVar113);
    auVar287 = ZEXT3264(auVar127);
    auVar128 = vpermt2ps_avx512vl(auVar143,_DAT_01feed00,auVar113);
    auVar139 = ZEXT1632(auVar94);
    auVar129 = vpermt2ps_avx512vl(auVar144,_DAT_01feed00,auVar139);
    auVar113 = vpermt2ps_avx512vl(auVar135,_DAT_01feed00,auVar139);
    auVar130 = vsubps_avx512vl(auVar123,auVar113);
    auVar113 = vsubps_avx(auVar124,auVar119);
    auVar282 = ZEXT3264(auVar113);
    auVar116 = vsubps_avx(auVar125,auVar120);
    auVar117 = vsubps_avx(auVar126,auVar121);
    auVar270 = ZEXT3264(auVar117);
    auVar118 = vmulps_avx512vl(auVar116,auVar144);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar143,auVar117);
    auVar131 = vmulps_avx512vl(auVar117,auVar142);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar144,auVar113);
    auVar132 = vmulps_avx512vl(auVar113,auVar143);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar142,auVar116);
    auVar132 = vmulps_avx512vl(auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar118,auVar118);
    auVar118 = vmulps_avx512vl(auVar117,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar116);
    auVar132 = vfmadd231ps_avx512vl(auVar118,auVar113,auVar113);
    auVar133 = vrcp14ps_avx512vl(auVar132);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = 0x3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar118 = vfnmadd213ps_avx512vl(auVar133,auVar132,auVar118);
    auVar118 = vfmadd132ps_avx512vl(auVar118,auVar133,auVar133);
    auVar131 = vmulps_avx512vl(auVar131,auVar118);
    auVar133 = vmulps_avx512vl(auVar116,auVar129);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar128,auVar117);
    auVar134 = vmulps_avx512vl(auVar117,auVar127);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar129,auVar113);
    auVar135 = vmulps_avx512vl(auVar113,auVar128);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar127,auVar116);
    auVar135 = vmulps_avx512vl(auVar135,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar118 = vmulps_avx512vl(auVar133,auVar118);
    auVar118 = vmaxps_avx512vl(auVar131,auVar118);
    auVar118 = vsqrtps_avx512vl(auVar118);
    auVar131 = vmaxps_avx512vl(auVar130,auVar123);
    auVar115 = vmaxps_avx512vl(auVar115,auVar131);
    auVar133 = vaddps_avx512vl(auVar118,auVar115);
    auVar115 = vminps_avx512vl(auVar130,auVar123);
    auVar115 = vminps_avx(auVar112,auVar115);
    auVar115 = vsubps_avx512vl(auVar115,auVar118);
    auVar123._8_4_ = 0x3f800002;
    auVar123._0_8_ = 0x3f8000023f800002;
    auVar123._12_4_ = 0x3f800002;
    auVar123._16_4_ = 0x3f800002;
    auVar123._20_4_ = 0x3f800002;
    auVar123._24_4_ = 0x3f800002;
    auVar123._28_4_ = 0x3f800002;
    auVar112 = vmulps_avx512vl(auVar133,auVar123);
    auVar130._8_4_ = 0x3f7ffffc;
    auVar130._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar130._12_4_ = 0x3f7ffffc;
    auVar130._16_4_ = 0x3f7ffffc;
    auVar130._20_4_ = 0x3f7ffffc;
    auVar130._24_4_ = 0x3f7ffffc;
    auVar130._28_4_ = 0x3f7ffffc;
    auVar115 = vmulps_avx512vl(auVar115,auVar130);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar118 = vrsqrt14ps_avx512vl(auVar132);
    auVar131._8_4_ = 0xbf000000;
    auVar131._0_8_ = 0xbf000000bf000000;
    auVar131._12_4_ = 0xbf000000;
    auVar131._16_4_ = 0xbf000000;
    auVar131._20_4_ = 0xbf000000;
    auVar131._24_4_ = 0xbf000000;
    auVar131._28_4_ = 0xbf000000;
    auVar123 = vmulps_avx512vl(auVar132,auVar131);
    fVar283 = auVar118._0_4_;
    fVar288 = auVar118._4_4_;
    fVar289 = auVar118._8_4_;
    fVar290 = auVar118._12_4_;
    fVar251 = auVar118._16_4_;
    fVar252 = auVar118._20_4_;
    fVar253 = auVar118._24_4_;
    auVar136._4_4_ = fVar288 * fVar288 * fVar288 * auVar123._4_4_;
    auVar136._0_4_ = fVar283 * fVar283 * fVar283 * auVar123._0_4_;
    auVar136._8_4_ = fVar289 * fVar289 * fVar289 * auVar123._8_4_;
    auVar136._12_4_ = fVar290 * fVar290 * fVar290 * auVar123._12_4_;
    auVar136._16_4_ = fVar251 * fVar251 * fVar251 * auVar123._16_4_;
    auVar136._20_4_ = fVar252 * fVar252 * fVar252 * auVar123._20_4_;
    auVar136._24_4_ = fVar253 * fVar253 * fVar253 * auVar123._24_4_;
    auVar136._28_4_ = auVar133._28_4_;
    auVar132._8_4_ = 0x3fc00000;
    auVar132._0_8_ = 0x3fc000003fc00000;
    auVar132._12_4_ = 0x3fc00000;
    auVar132._16_4_ = 0x3fc00000;
    auVar132._20_4_ = 0x3fc00000;
    auVar132._24_4_ = 0x3fc00000;
    auVar132._28_4_ = 0x3fc00000;
    auVar118 = vfmadd231ps_avx512vl(auVar136,auVar118,auVar132);
    auVar123 = vmulps_avx512vl(auVar113,auVar118);
    auVar130 = vmulps_avx512vl(auVar116,auVar118);
    auVar131 = vmulps_avx512vl(auVar117,auVar118);
    auVar132 = vsubps_avx512vl(auVar139,auVar119);
    auVar133 = vsubps_avx512vl(auVar139,auVar120);
    auVar134 = vsubps_avx512vl(auVar139,auVar121);
    auVar135 = vmulps_avx512vl(local_820,auVar134);
    auVar135 = vfmadd231ps_avx512vl(auVar135,local_800,auVar133);
    auVar135 = vfmadd231ps_avx512vl(auVar135,_local_7e0,auVar132);
    auVar136 = vmulps_avx512vl(auVar134,auVar134);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar133,auVar133);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar132,auVar132);
    auVar137 = vmulps_avx512vl(local_820,auVar131);
    auVar137 = vfmadd231ps_avx512vl(auVar137,auVar130,local_800);
    auVar137 = vfmadd231ps_avx512vl(auVar137,auVar123,_local_7e0);
    auVar131 = vmulps_avx512vl(auVar134,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar133,auVar130);
    auVar123 = vfmadd231ps_avx512vl(auVar130,auVar132,auVar123);
    auVar130 = vmulps_avx512vl(auVar137,auVar137);
    auVar131 = vsubps_avx512vl(local_560,auVar130);
    auVar138 = vmulps_avx512vl(auVar137,auVar123);
    auVar135 = vsubps_avx512vl(auVar135,auVar138);
    auVar135 = vaddps_avx512vl(auVar135,auVar135);
    auVar138 = vmulps_avx512vl(auVar123,auVar123);
    local_a40 = vsubps_avx512vl(auVar136,auVar138);
    auVar112 = vsubps_avx512vl(local_a40,auVar112);
    auVar136 = vmulps_avx512vl(auVar135,auVar135);
    _local_aa0 = vmulps_avx512vl(auVar131,auVar114);
    auVar138 = vmulps_avx512vl(_local_aa0,auVar112);
    auVar138 = vsubps_avx512vl(auVar136,auVar138);
    auVar94 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
    uVar85 = vcmpps_avx512vl(auVar138,auVar139,5);
    bVar74 = (byte)uVar85;
    fVar283 = (float)local_a00._0_4_;
    fVar288 = (float)local_a00._4_4_;
    fVar289 = fStack_9f8;
    fVar290 = fStack_9f4;
    fVar251 = fStack_9f0;
    fVar252 = fStack_9ec;
    fVar253 = fStack_9e8;
    fVar254 = fStack_9e4;
    if (bVar74 == 0) {
LAB_01baae94:
      auVar304 = ZEXT3264(local_ae0);
      auVar305 = ZEXT3264(local_b00);
      auVar306 = ZEXT3264(local_b20);
      auVar307 = ZEXT3264(local_b40);
      auVar308 = ZEXT3264(local_b60);
    }
    else {
      local_7c0._0_32_ = auVar136;
      auVar138 = vsqrtps_avx512vl(auVar138);
      auVar139 = vaddps_avx512vl(auVar131,auVar131);
      _local_860 = vrcp14ps_avx512vl(auVar139);
      auVar114._8_4_ = 0x3f800000;
      auVar114._0_8_ = 0x3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar114._16_4_ = 0x3f800000;
      auVar114._20_4_ = 0x3f800000;
      auVar114._24_4_ = 0x3f800000;
      auVar114._28_4_ = 0x3f800000;
      auVar114 = vfnmadd213ps_avx512vl(_local_860,auVar139,auVar114);
      auVar114 = vfmadd132ps_avx512vl(auVar114,_local_860,_local_860);
      local_880 = vxorps_avx512vl(auVar135,auVar122);
      auVar122 = vsubps_avx512vl(local_880,auVar138);
      local_ac0 = vmulps_avx512vl(auVar122,auVar114);
      auVar122 = vsubps_avx512vl(auVar138,auVar135);
      local_840 = vmulps_avx512vl(auVar122,auVar114);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar122,local_ac0);
      auVar140._0_4_ =
           (uint)(bVar74 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar122._0_4_;
      bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar9 * auVar114._4_4_ | (uint)!bVar9 * auVar122._4_4_;
      bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar9 * auVar114._8_4_ | (uint)!bVar9 * auVar122._8_4_;
      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar9 * auVar114._12_4_ | (uint)!bVar9 * auVar122._12_4_;
      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * auVar122._16_4_;
      bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar9 * auVar114._20_4_ | (uint)!bVar9 * auVar122._20_4_;
      bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar9 * auVar114._24_4_ | (uint)!bVar9 * auVar122._24_4_;
      bVar9 = SUB81(uVar85 >> 7,0);
      auVar140._28_4_ = (uint)bVar9 * auVar114._28_4_ | (uint)!bVar9 * auVar122._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar122,local_840);
      auVar141._0_4_ =
           (uint)(bVar74 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar122._0_4_;
      bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar141._4_4_ = (uint)bVar9 * auVar114._4_4_ | (uint)!bVar9 * auVar122._4_4_;
      bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar141._8_4_ = (uint)bVar9 * auVar114._8_4_ | (uint)!bVar9 * auVar122._8_4_;
      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar141._12_4_ = (uint)bVar9 * auVar114._12_4_ | (uint)!bVar9 * auVar122._12_4_;
      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar141._16_4_ = (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * auVar122._16_4_;
      bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar141._20_4_ = (uint)bVar9 * auVar114._20_4_ | (uint)!bVar9 * auVar122._20_4_;
      bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar141._24_4_ = (uint)bVar9 * auVar114._24_4_ | (uint)!bVar9 * auVar122._24_4_;
      bVar9 = SUB81(uVar85 >> 7,0);
      auVar141._28_4_ = (uint)bVar9 * auVar114._28_4_ | (uint)!bVar9 * auVar122._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar130,auVar122);
      local_8a0 = vmaxps_avx512vl(local_580,auVar122);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      local_8c0 = vmulps_avx512vl(local_8a0,auVar37);
      vandps_avx512vl(auVar131,auVar122);
      uVar25 = vcmpps_avx512vl(local_8c0,local_8c0,1);
      uVar85 = uVar85 & uVar25;
      bVar79 = (byte)uVar85;
      if (bVar79 != 0) {
        uVar25 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar94),2);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar131 = vblendmps_avx512vl(auVar112,auVar130);
        bVar80 = (byte)uVar25;
        uVar87 = (uint)(bVar80 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar80 & 1) * local_8c0._0_4_;
        bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
        uVar86 = (uint)bVar9 * auVar131._4_4_ | (uint)!bVar9 * local_8c0._4_4_;
        bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
        uVar157 = (uint)bVar9 * auVar131._8_4_ | (uint)!bVar9 * local_8c0._8_4_;
        bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
        uVar158 = (uint)bVar9 * auVar131._12_4_ | (uint)!bVar9 * local_8c0._12_4_;
        bVar9 = (bool)((byte)(uVar25 >> 4) & 1);
        uVar159 = (uint)bVar9 * auVar131._16_4_ | (uint)!bVar9 * local_8c0._16_4_;
        bVar9 = (bool)((byte)(uVar25 >> 5) & 1);
        uVar160 = (uint)bVar9 * auVar131._20_4_ | (uint)!bVar9 * local_8c0._20_4_;
        bVar9 = (bool)((byte)(uVar25 >> 6) & 1);
        uVar161 = (uint)bVar9 * auVar131._24_4_ | (uint)!bVar9 * local_8c0._24_4_;
        bVar9 = SUB81(uVar25 >> 7,0);
        uVar162 = (uint)bVar9 * auVar131._28_4_ | (uint)!bVar9 * local_8c0._28_4_;
        auVar140._0_4_ = (bVar79 & 1) * uVar87 | !(bool)(bVar79 & 1) * auVar140._0_4_;
        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar140._4_4_ = bVar9 * uVar86 | !bVar9 * auVar140._4_4_;
        bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar140._8_4_ = bVar9 * uVar157 | !bVar9 * auVar140._8_4_;
        bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar140._12_4_ = bVar9 * uVar158 | !bVar9 * auVar140._12_4_;
        bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar140._16_4_ = bVar9 * uVar159 | !bVar9 * auVar140._16_4_;
        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar140._20_4_ = bVar9 * uVar160 | !bVar9 * auVar140._20_4_;
        bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar140._24_4_ = bVar9 * uVar161 | !bVar9 * auVar140._24_4_;
        bVar9 = SUB81(uVar85 >> 7,0);
        auVar140._28_4_ = bVar9 * uVar162 | !bVar9 * auVar140._28_4_;
        auVar112 = vblendmps_avx512vl(auVar130,auVar112);
        bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar25 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar25 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar25 >> 6) & 1);
        bVar16 = SUB81(uVar25 >> 7,0);
        auVar141._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar80 & 1) * auVar112._0_4_ | !(bool)(bVar80 & 1) * uVar87) |
             !(bool)(bVar79 & 1) * auVar141._0_4_;
        bVar10 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar141._4_4_ =
             (uint)bVar10 * ((uint)bVar9 * auVar112._4_4_ | !bVar9 * uVar86) |
             !bVar10 * auVar141._4_4_;
        bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar141._8_4_ =
             (uint)bVar9 * ((uint)bVar11 * auVar112._8_4_ | !bVar11 * uVar157) |
             !bVar9 * auVar141._8_4_;
        bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar141._12_4_ =
             (uint)bVar9 * ((uint)bVar12 * auVar112._12_4_ | !bVar12 * uVar158) |
             !bVar9 * auVar141._12_4_;
        bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar141._16_4_ =
             (uint)bVar9 * ((uint)bVar13 * auVar112._16_4_ | !bVar13 * uVar159) |
             !bVar9 * auVar141._16_4_;
        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar141._20_4_ =
             (uint)bVar9 * ((uint)bVar14 * auVar112._20_4_ | !bVar14 * uVar160) |
             !bVar9 * auVar141._20_4_;
        bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar141._24_4_ =
             (uint)bVar9 * ((uint)bVar15 * auVar112._24_4_ | !bVar15 * uVar161) |
             !bVar9 * auVar141._24_4_;
        bVar9 = SUB81(uVar85 >> 7,0);
        auVar141._28_4_ =
             (uint)bVar9 * ((uint)bVar16 * auVar112._28_4_ | !bVar16 * uVar162) |
             !bVar9 * auVar141._28_4_;
        bVar74 = (~bVar79 | bVar80) & bVar74;
      }
      if ((bVar74 & 0x7f) == 0) {
        auVar304 = ZEXT3264(local_ae0);
        auVar305 = ZEXT3264(local_b00);
        auVar306 = ZEXT3264(local_b20);
        auVar307 = ZEXT3264(local_b40);
        auVar308 = ZEXT3264(local_b60);
      }
      else {
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar129 = vxorps_avx512vl(auVar129,auVar122);
        auVar127 = vxorps_avx512vl(auVar127,auVar122);
        uVar87 = *(uint *)(ray + k * 4 + 0x200);
        auVar128 = vxorps_avx512vl(auVar128,auVar122);
        auVar94 = vsubss_avx512f(ZEXT416(uVar87),ZEXT416((uint)local_950._0_4_));
        auVar112 = vbroadcastss_avx512vl(auVar94);
        auVar114 = vminps_avx512vl(auVar112,auVar141);
        auVar73._4_4_ = fStack_61c;
        auVar73._0_4_ = local_620;
        auVar73._8_4_ = fStack_618;
        auVar73._12_4_ = fStack_614;
        auVar73._16_4_ = fStack_610;
        auVar73._20_4_ = fStack_60c;
        auVar73._24_4_ = fStack_608;
        auVar73._28_4_ = fStack_604;
        auVar112 = vmaxps_avx512vl(auVar73,auVar140);
        auVar130 = vmulps_avx512vl(auVar144,auVar134);
        auVar130 = vfmadd213ps_avx512vl(auVar133,auVar143,auVar130);
        auVar94 = vfmadd213ps_fma(auVar132,auVar142,auVar130);
        auVar130 = vmulps_avx512vl(local_820,auVar144);
        auVar130 = vfmadd231ps_avx512vl(auVar130,local_800,auVar143);
        auVar95 = vfmadd231ps_fma(auVar130,_local_7e0,auVar142);
        auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar95),auVar132);
        auVar133 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar24 = vcmpps_avx512vl(auVar132,auVar133,1);
        auVar130 = vxorps_avx512vl(ZEXT1632(auVar94),auVar122);
        auVar131 = vrcp14ps_avx512vl(ZEXT1632(auVar95));
        auVar138 = ZEXT1632(auVar95);
        auVar134 = vxorps_avx512vl(auVar138,auVar122);
        auVar142 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar143 = vfnmadd213ps_avx512vl(auVar131,auVar138,auVar142);
        auVar94 = vfmadd132ps_fma(auVar143,auVar131,auVar131);
        fVar255 = auVar94._0_4_ * auVar130._0_4_;
        fVar261 = auVar94._4_4_ * auVar130._4_4_;
        auVar42._4_4_ = fVar261;
        auVar42._0_4_ = fVar255;
        fVar262 = auVar94._8_4_ * auVar130._8_4_;
        auVar42._8_4_ = fVar262;
        fVar263 = auVar94._12_4_ * auVar130._12_4_;
        auVar42._12_4_ = fVar263;
        fVar164 = auVar130._16_4_ * 0.0;
        auVar42._16_4_ = fVar164;
        fVar185 = auVar130._20_4_ * 0.0;
        auVar42._20_4_ = fVar185;
        fVar186 = auVar130._24_4_ * 0.0;
        auVar42._24_4_ = fVar186;
        auVar42._28_4_ = auVar130._28_4_;
        uVar26 = vcmpps_avx512vl(auVar138,auVar134,1);
        bVar79 = (byte)uVar24 | (byte)uVar26;
        auVar143 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar144 = vblendmps_avx512vl(auVar42,auVar143);
        auVar145._0_4_ =
             (uint)(bVar79 & 1) * auVar144._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar131._0_4_;
        bVar9 = (bool)(bVar79 >> 1 & 1);
        auVar145._4_4_ = (uint)bVar9 * auVar144._4_4_ | (uint)!bVar9 * auVar131._4_4_;
        bVar9 = (bool)(bVar79 >> 2 & 1);
        auVar145._8_4_ = (uint)bVar9 * auVar144._8_4_ | (uint)!bVar9 * auVar131._8_4_;
        bVar9 = (bool)(bVar79 >> 3 & 1);
        auVar145._12_4_ = (uint)bVar9 * auVar144._12_4_ | (uint)!bVar9 * auVar131._12_4_;
        bVar9 = (bool)(bVar79 >> 4 & 1);
        auVar145._16_4_ = (uint)bVar9 * auVar144._16_4_ | (uint)!bVar9 * auVar131._16_4_;
        bVar9 = (bool)(bVar79 >> 5 & 1);
        auVar145._20_4_ = (uint)bVar9 * auVar144._20_4_ | (uint)!bVar9 * auVar131._20_4_;
        bVar9 = (bool)(bVar79 >> 6 & 1);
        auVar145._24_4_ = (uint)bVar9 * auVar144._24_4_ | (uint)!bVar9 * auVar131._24_4_;
        auVar145._28_4_ =
             (uint)(bVar79 >> 7) * auVar144._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar131._28_4_;
        auVar144 = vmaxps_avx512vl(auVar112,auVar145);
        auVar300 = ZEXT3264(auVar144);
        uVar26 = vcmpps_avx512vl(auVar138,auVar134,6);
        bVar79 = (byte)uVar24 | (byte)uVar26;
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar146._0_4_ =
             (uint)(bVar79 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar255;
        bVar9 = (bool)(bVar79 >> 1 & 1);
        auVar146._4_4_ = (uint)bVar9 * auVar134._4_4_ | (uint)!bVar9 * (int)fVar261;
        bVar9 = (bool)(bVar79 >> 2 & 1);
        auVar146._8_4_ = (uint)bVar9 * auVar134._8_4_ | (uint)!bVar9 * (int)fVar262;
        bVar9 = (bool)(bVar79 >> 3 & 1);
        auVar146._12_4_ = (uint)bVar9 * auVar134._12_4_ | (uint)!bVar9 * (int)fVar263;
        bVar9 = (bool)(bVar79 >> 4 & 1);
        auVar146._16_4_ = (uint)bVar9 * auVar134._16_4_ | (uint)!bVar9 * (int)fVar164;
        bVar9 = (bool)(bVar79 >> 5 & 1);
        auVar146._20_4_ = (uint)bVar9 * auVar134._20_4_ | (uint)!bVar9 * (int)fVar185;
        bVar9 = (bool)(bVar79 >> 6 & 1);
        auVar146._24_4_ = (uint)bVar9 * auVar134._24_4_ | (uint)!bVar9 * (int)fVar186;
        auVar146._28_4_ =
             (uint)(bVar79 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar130._28_4_;
        auVar138 = vminps_avx512vl(auVar114,auVar146);
        auVar112 = vsubps_avx(ZEXT832(0) << 0x20,auVar124);
        auVar130 = vsubps_avx(ZEXT832(0) << 0x20,auVar125);
        auVar124 = ZEXT832(0) << 0x20;
        auVar131 = vsubps_avx(auVar124,auVar126);
        auVar131 = vmulps_avx512vl(auVar131,auVar129);
        auVar130 = vfmadd231ps_avx512vl(auVar131,auVar128,auVar130);
        auVar112 = vfmadd231ps_avx512vl(auVar130,auVar127,auVar112);
        auVar130 = vmulps_avx512vl(local_820,auVar129);
        auVar130 = vfmadd231ps_avx512vl(auVar130,local_800,auVar128);
        auVar130 = vfmadd231ps_avx512vl(auVar130,_local_7e0,auVar127);
        vandps_avx512vl(auVar130,auVar132);
        uVar24 = vcmpps_avx512vl(auVar130,auVar133,1);
        auVar112 = vxorps_avx512vl(auVar112,auVar122);
        auVar131 = vrcp14ps_avx512vl(auVar130);
        auVar132 = vxorps_avx512vl(auVar130,auVar122);
        auVar295 = ZEXT3264(auVar132);
        auVar122 = vfnmadd213ps_avx512vl(auVar131,auVar130,auVar142);
        auVar94 = vfmadd132ps_fma(auVar122,auVar131,auVar131);
        fVar255 = auVar94._0_4_ * auVar112._0_4_;
        fVar261 = auVar94._4_4_ * auVar112._4_4_;
        auVar43._4_4_ = fVar261;
        auVar43._0_4_ = fVar255;
        fVar262 = auVar94._8_4_ * auVar112._8_4_;
        auVar43._8_4_ = fVar262;
        fVar263 = auVar94._12_4_ * auVar112._12_4_;
        auVar43._12_4_ = fVar263;
        fVar164 = auVar112._16_4_ * 0.0;
        auVar43._16_4_ = fVar164;
        fVar185 = auVar112._20_4_ * 0.0;
        auVar43._20_4_ = fVar185;
        fVar186 = auVar112._24_4_ * 0.0;
        auVar43._24_4_ = fVar186;
        auVar43._28_4_ = auVar112._28_4_;
        uVar26 = vcmpps_avx512vl(auVar130,auVar132,1);
        bVar79 = (byte)uVar24 | (byte)uVar26;
        auVar122 = vblendmps_avx512vl(auVar43,auVar143);
        auVar147._0_4_ =
             (uint)(bVar79 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar131._0_4_;
        bVar9 = (bool)(bVar79 >> 1 & 1);
        auVar147._4_4_ = (uint)bVar9 * auVar122._4_4_ | (uint)!bVar9 * auVar131._4_4_;
        bVar9 = (bool)(bVar79 >> 2 & 1);
        auVar147._8_4_ = (uint)bVar9 * auVar122._8_4_ | (uint)!bVar9 * auVar131._8_4_;
        bVar9 = (bool)(bVar79 >> 3 & 1);
        auVar147._12_4_ = (uint)bVar9 * auVar122._12_4_ | (uint)!bVar9 * auVar131._12_4_;
        bVar9 = (bool)(bVar79 >> 4 & 1);
        auVar147._16_4_ = (uint)bVar9 * auVar122._16_4_ | (uint)!bVar9 * auVar131._16_4_;
        bVar9 = (bool)(bVar79 >> 5 & 1);
        auVar147._20_4_ = (uint)bVar9 * auVar122._20_4_ | (uint)!bVar9 * auVar131._20_4_;
        bVar9 = (bool)(bVar79 >> 6 & 1);
        auVar147._24_4_ = (uint)bVar9 * auVar122._24_4_ | (uint)!bVar9 * auVar131._24_4_;
        auVar147._28_4_ =
             (uint)(bVar79 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar131._28_4_;
        auVar293 = ZEXT3264(auVar147);
        _local_8e0 = vmaxps_avx(auVar144,auVar147);
        auVar287 = ZEXT3264(_local_8e0);
        uVar26 = vcmpps_avx512vl(auVar130,auVar132,6);
        bVar79 = (byte)uVar24 | (byte)uVar26;
        auVar148._0_4_ =
             (uint)(bVar79 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar255;
        bVar9 = (bool)(bVar79 >> 1 & 1);
        auVar148._4_4_ = (uint)bVar9 * auVar134._4_4_ | (uint)!bVar9 * (int)fVar261;
        bVar9 = (bool)(bVar79 >> 2 & 1);
        auVar148._8_4_ = (uint)bVar9 * auVar134._8_4_ | (uint)!bVar9 * (int)fVar262;
        bVar9 = (bool)(bVar79 >> 3 & 1);
        auVar148._12_4_ = (uint)bVar9 * auVar134._12_4_ | (uint)!bVar9 * (int)fVar263;
        bVar9 = (bool)(bVar79 >> 4 & 1);
        auVar148._16_4_ = (uint)bVar9 * auVar134._16_4_ | (uint)!bVar9 * (int)fVar164;
        bVar9 = (bool)(bVar79 >> 5 & 1);
        auVar148._20_4_ = (uint)bVar9 * auVar134._20_4_ | (uint)!bVar9 * (int)fVar185;
        bVar9 = (bool)(bVar79 >> 6 & 1);
        auVar148._24_4_ = (uint)bVar9 * auVar134._24_4_ | (uint)!bVar9 * (int)fVar186;
        auVar148._28_4_ =
             (uint)(bVar79 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar112._28_4_;
        local_680 = vminps_avx(auVar138,auVar148);
        auVar292 = ZEXT3264(local_680);
        uVar24 = vcmpps_avx512vl(_local_8e0,local_680,2);
        bVar74 = bVar74 & 0x7f & (byte)uVar24;
        if (bVar74 == 0) goto LAB_01baae94;
        auVar115 = vmaxps_avx(auVar124,auVar115);
        auVar112 = vfmadd213ps_avx512vl(local_ac0,auVar137,auVar123);
        fVar255 = auVar118._0_4_;
        fVar261 = auVar118._4_4_;
        auVar44._4_4_ = fVar261 * auVar112._4_4_;
        auVar44._0_4_ = fVar255 * auVar112._0_4_;
        fVar262 = auVar118._8_4_;
        auVar44._8_4_ = fVar262 * auVar112._8_4_;
        fVar263 = auVar118._12_4_;
        auVar44._12_4_ = fVar263 * auVar112._12_4_;
        fVar164 = auVar118._16_4_;
        auVar44._16_4_ = fVar164 * auVar112._16_4_;
        fVar185 = auVar118._20_4_;
        auVar44._20_4_ = fVar185 * auVar112._20_4_;
        fVar186 = auVar118._24_4_;
        auVar44._24_4_ = fVar186 * auVar112._24_4_;
        auVar44._28_4_ = auVar112._28_4_;
        auVar112 = vfmadd213ps_avx512vl(local_840,auVar137,auVar123);
        auVar45._4_4_ = fVar261 * auVar112._4_4_;
        auVar45._0_4_ = fVar255 * auVar112._0_4_;
        auVar45._8_4_ = fVar262 * auVar112._8_4_;
        auVar45._12_4_ = fVar263 * auVar112._12_4_;
        auVar45._16_4_ = fVar164 * auVar112._16_4_;
        auVar45._20_4_ = fVar185 * auVar112._20_4_;
        auVar45._24_4_ = fVar186 * auVar112._24_4_;
        auVar45._28_4_ = auVar147._28_4_;
        auVar112 = vminps_avx512vl(auVar44,auVar142);
        auVar130 = ZEXT832(0) << 0x20;
        auVar112 = vmaxps_avx(auVar112,ZEXT832(0) << 0x20);
        auVar131 = vminps_avx512vl(auVar45,auVar142);
        auVar46._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar112._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar46,auVar174,local_a80);
        auVar112 = vmaxps_avx(auVar131,ZEXT832(0) << 0x20);
        auVar47._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar112._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar47,auVar174,local_a80);
        auVar48._4_4_ = auVar115._4_4_ * auVar115._4_4_;
        auVar48._0_4_ = auVar115._0_4_ * auVar115._0_4_;
        auVar48._8_4_ = auVar115._8_4_ * auVar115._8_4_;
        auVar48._12_4_ = auVar115._12_4_ * auVar115._12_4_;
        auVar48._16_4_ = auVar115._16_4_ * auVar115._16_4_;
        auVar48._20_4_ = auVar115._20_4_ * auVar115._20_4_;
        auVar48._24_4_ = auVar115._24_4_ * auVar115._24_4_;
        auVar48._28_4_ = auVar115._28_4_;
        auVar112 = vsubps_avx(local_a40,auVar48);
        auVar49._4_4_ = auVar112._4_4_ * (float)local_aa0._4_4_;
        auVar49._0_4_ = auVar112._0_4_ * (float)local_aa0._0_4_;
        auVar49._8_4_ = auVar112._8_4_ * fStack_a98;
        auVar49._12_4_ = auVar112._12_4_ * fStack_a94;
        auVar49._16_4_ = auVar112._16_4_ * fStack_a90;
        auVar49._20_4_ = auVar112._20_4_ * fStack_a8c;
        auVar49._24_4_ = auVar112._24_4_ * fStack_a88;
        auVar49._28_4_ = auVar115._28_4_;
        auVar115 = vsubps_avx(auVar136,auVar49);
        uVar24 = vcmpps_avx512vl(auVar115,ZEXT832(0) << 0x20,5);
        bVar79 = (byte)uVar24;
        auVar307 = ZEXT3264(local_b40);
        auVar308 = ZEXT3264(local_b60);
        if (bVar79 == 0) {
          bVar79 = 0;
          auVar113 = ZEXT832(0) << 0x20;
          auVar183 = ZEXT864(0) << 0x20;
          auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar131 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar293 = ZEXT864(0) << 0x20;
          auVar149._8_4_ = 0x7f800000;
          auVar149._0_8_ = 0x7f8000007f800000;
          auVar149._12_4_ = 0x7f800000;
          auVar149._16_4_ = 0x7f800000;
          auVar149._20_4_ = 0x7f800000;
          auVar149._24_4_ = 0x7f800000;
          auVar149._28_4_ = 0x7f800000;
          auVar150._8_4_ = 0xff800000;
          auVar150._0_8_ = 0xff800000ff800000;
          auVar150._12_4_ = 0xff800000;
          auVar150._16_4_ = 0xff800000;
          auVar150._20_4_ = 0xff800000;
          auVar150._24_4_ = 0xff800000;
          auVar150._28_4_ = 0xff800000;
        }
        else {
          auVar95 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
          uVar85 = vcmpps_avx512vl(auVar115,auVar124,5);
          auVar115 = vsqrtps_avx(auVar115);
          auVar130 = vfnmadd213ps_avx512vl(auVar139,_local_860,auVar142);
          auVar132 = vfmadd132ps_avx512vl(auVar130,_local_860,_local_860);
          auVar130 = vsubps_avx(local_880,auVar115);
          auVar122 = vmulps_avx512vl(auVar130,auVar132);
          auVar115 = vsubps_avx512vl(auVar115,auVar135);
          auVar132 = vmulps_avx512vl(auVar115,auVar132);
          auVar115 = vfmadd213ps_avx512vl(auVar137,auVar122,auVar123);
          auVar50._4_4_ = fVar261 * auVar115._4_4_;
          auVar50._0_4_ = fVar255 * auVar115._0_4_;
          auVar50._8_4_ = fVar262 * auVar115._8_4_;
          auVar50._12_4_ = fVar263 * auVar115._12_4_;
          auVar50._16_4_ = fVar164 * auVar115._16_4_;
          auVar50._20_4_ = fVar185 * auVar115._20_4_;
          auVar50._24_4_ = fVar186 * auVar115._24_4_;
          auVar50._28_4_ = auVar131._28_4_;
          auVar51._4_4_ = (float)local_7e0._4_4_ * auVar122._4_4_;
          auVar51._0_4_ = (float)local_7e0._0_4_ * auVar122._0_4_;
          auVar51._8_4_ = fStack_7d8 * auVar122._8_4_;
          auVar51._12_4_ = fStack_7d4 * auVar122._12_4_;
          auVar51._16_4_ = fStack_7d0 * auVar122._16_4_;
          auVar51._20_4_ = fStack_7cc * auVar122._20_4_;
          auVar51._24_4_ = fStack_7c8 * auVar122._24_4_;
          auVar51._28_4_ = auVar115._28_4_;
          auVar130 = vmulps_avx512vl(local_800,auVar122);
          auVar124 = vmulps_avx512vl(local_820,auVar122);
          auVar115 = vfmadd213ps_avx512vl(auVar113,auVar50,auVar119);
          auVar115 = vsubps_avx512vl(auVar51,auVar115);
          auVar131 = vfmadd213ps_avx512vl(auVar116,auVar50,auVar120);
          auVar131 = vsubps_avx512vl(auVar130,auVar131);
          auVar94 = vfmadd213ps_fma(auVar50,auVar117,auVar121);
          auVar130 = vsubps_avx(auVar124,ZEXT1632(auVar94));
          auVar293 = ZEXT3264(auVar130);
          auVar123 = vfmadd213ps_avx512vl(auVar137,auVar132,auVar123);
          auVar118 = vmulps_avx512vl(auVar118,auVar123);
          auVar52._4_4_ = (float)local_7e0._4_4_ * auVar132._4_4_;
          auVar52._0_4_ = (float)local_7e0._0_4_ * auVar132._0_4_;
          auVar52._8_4_ = fStack_7d8 * auVar132._8_4_;
          auVar52._12_4_ = fStack_7d4 * auVar132._12_4_;
          auVar52._16_4_ = fStack_7d0 * auVar132._16_4_;
          auVar52._20_4_ = fStack_7cc * auVar132._20_4_;
          auVar52._24_4_ = fStack_7c8 * auVar132._24_4_;
          auVar52._28_4_ = auVar124._28_4_;
          auVar123 = vmulps_avx512vl(local_800,auVar132);
          auVar124 = vmulps_avx512vl(local_820,auVar132);
          auVar94 = vfmadd213ps_fma(auVar113,auVar118,auVar119);
          auVar130 = vsubps_avx(auVar52,ZEXT1632(auVar94));
          auVar94 = vfmadd213ps_fma(auVar116,auVar118,auVar120);
          auVar113 = vsubps_avx512vl(auVar123,ZEXT1632(auVar94));
          auVar94 = vfmadd213ps_fma(auVar117,auVar118,auVar121);
          auVar116 = vsubps_avx512vl(auVar124,ZEXT1632(auVar94));
          auVar183 = ZEXT3264(auVar116);
          auVar175._8_4_ = 0x7f800000;
          auVar175._0_8_ = 0x7f8000007f800000;
          auVar175._12_4_ = 0x7f800000;
          auVar175._16_4_ = 0x7f800000;
          auVar175._20_4_ = 0x7f800000;
          auVar175._24_4_ = 0x7f800000;
          auVar175._28_4_ = 0x7f800000;
          auVar116 = vblendmps_avx512vl(auVar175,auVar122);
          bVar9 = (bool)((byte)uVar85 & 1);
          auVar149._0_4_ = (uint)bVar9 * auVar116._0_4_ | (uint)!bVar9 * auVar119._0_4_;
          bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar149._4_4_ = (uint)bVar9 * auVar116._4_4_ | (uint)!bVar9 * auVar119._4_4_;
          bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar149._8_4_ = (uint)bVar9 * auVar116._8_4_ | (uint)!bVar9 * auVar119._8_4_;
          bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar149._12_4_ = (uint)bVar9 * auVar116._12_4_ | (uint)!bVar9 * auVar119._12_4_;
          bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar149._16_4_ = (uint)bVar9 * auVar116._16_4_ | (uint)!bVar9 * auVar119._16_4_;
          bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar149._20_4_ = (uint)bVar9 * auVar116._20_4_ | (uint)!bVar9 * auVar119._20_4_;
          bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar149._24_4_ = (uint)bVar9 * auVar116._24_4_ | (uint)!bVar9 * auVar119._24_4_;
          bVar9 = SUB81(uVar85 >> 7,0);
          auVar149._28_4_ = (uint)bVar9 * auVar116._28_4_ | (uint)!bVar9 * auVar119._28_4_;
          auVar176._8_4_ = 0xff800000;
          auVar176._0_8_ = 0xff800000ff800000;
          auVar176._12_4_ = 0xff800000;
          auVar176._16_4_ = 0xff800000;
          auVar176._20_4_ = 0xff800000;
          auVar176._24_4_ = 0xff800000;
          auVar176._28_4_ = 0xff800000;
          auVar116 = vblendmps_avx512vl(auVar176,auVar132);
          bVar9 = (bool)((byte)uVar85 & 1);
          auVar150._0_4_ = (uint)bVar9 * auVar116._0_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar9 * auVar116._4_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar9 * auVar116._8_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar9 * auVar116._12_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar150._16_4_ = (uint)bVar9 * auVar116._16_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar150._20_4_ = (uint)bVar9 * auVar116._20_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar150._24_4_ = (uint)bVar9 * auVar116._24_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = SUB81(uVar85 >> 7,0);
          auVar150._28_4_ = (uint)bVar9 * auVar116._28_4_ | (uint)!bVar9 * -0x800000;
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar116 = vmulps_avx512vl(local_8a0,auVar38);
          uVar25 = vcmpps_avx512vl(auVar116,local_8c0,0xe);
          uVar85 = uVar85 & uVar25;
          bVar80 = (byte)uVar85;
          if (bVar80 != 0) {
            uVar25 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar95),2);
            auVar281._8_4_ = 0x7f800000;
            auVar281._0_8_ = 0x7f8000007f800000;
            auVar281._12_4_ = 0x7f800000;
            auVar281._16_4_ = 0x7f800000;
            auVar281._20_4_ = 0x7f800000;
            auVar281._24_4_ = 0x7f800000;
            auVar281._28_4_ = 0x7f800000;
            auVar299._8_4_ = 0xff800000;
            auVar299._0_8_ = 0xff800000ff800000;
            auVar299._12_4_ = 0xff800000;
            auVar299._16_4_ = 0xff800000;
            auVar299._20_4_ = 0xff800000;
            auVar299._24_4_ = 0xff800000;
            auVar299._28_4_ = 0xff800000;
            auVar112 = vblendmps_avx512vl(auVar281,auVar299);
            bVar83 = (byte)uVar25;
            uVar86 = (uint)(bVar83 & 1) * auVar112._0_4_ |
                     (uint)!(bool)(bVar83 & 1) * auVar116._0_4_;
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            uVar157 = (uint)bVar9 * auVar112._4_4_ | (uint)!bVar9 * auVar116._4_4_;
            bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
            uVar158 = (uint)bVar9 * auVar112._8_4_ | (uint)!bVar9 * auVar116._8_4_;
            bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
            uVar159 = (uint)bVar9 * auVar112._12_4_ | (uint)!bVar9 * auVar116._12_4_;
            bVar9 = (bool)((byte)(uVar25 >> 4) & 1);
            uVar160 = (uint)bVar9 * auVar112._16_4_ | (uint)!bVar9 * auVar116._16_4_;
            bVar9 = (bool)((byte)(uVar25 >> 5) & 1);
            uVar161 = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * auVar116._20_4_;
            bVar9 = (bool)((byte)(uVar25 >> 6) & 1);
            uVar162 = (uint)bVar9 * auVar112._24_4_ | (uint)!bVar9 * auVar116._24_4_;
            bVar9 = SUB81(uVar25 >> 7,0);
            uVar163 = (uint)bVar9 * auVar112._28_4_ | (uint)!bVar9 * auVar116._28_4_;
            auVar149._0_4_ = (bVar80 & 1) * uVar86 | !(bool)(bVar80 & 1) * auVar149._0_4_;
            bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar149._4_4_ = bVar9 * uVar157 | !bVar9 * auVar149._4_4_;
            bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar149._8_4_ = bVar9 * uVar158 | !bVar9 * auVar149._8_4_;
            bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar149._12_4_ = bVar9 * uVar159 | !bVar9 * auVar149._12_4_;
            bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar149._16_4_ = bVar9 * uVar160 | !bVar9 * auVar149._16_4_;
            bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar149._20_4_ = bVar9 * uVar161 | !bVar9 * auVar149._20_4_;
            bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar149._24_4_ = bVar9 * uVar162 | !bVar9 * auVar149._24_4_;
            bVar9 = SUB81(uVar85 >> 7,0);
            auVar149._28_4_ = bVar9 * uVar163 | !bVar9 * auVar149._28_4_;
            auVar112 = vblendmps_avx512vl(auVar299,auVar281);
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar25 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar25 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar25 >> 6) & 1);
            bVar16 = SUB81(uVar25 >> 7,0);
            auVar150._0_4_ =
                 (uint)(bVar80 & 1) *
                 ((uint)(bVar83 & 1) * auVar112._0_4_ | !(bool)(bVar83 & 1) * uVar86) |
                 !(bool)(bVar80 & 1) * auVar150._0_4_;
            bVar10 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar150._4_4_ =
                 (uint)bVar10 * ((uint)bVar9 * auVar112._4_4_ | !bVar9 * uVar157) |
                 !bVar10 * auVar150._4_4_;
            bVar9 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar150._8_4_ =
                 (uint)bVar9 * ((uint)bVar11 * auVar112._8_4_ | !bVar11 * uVar158) |
                 !bVar9 * auVar150._8_4_;
            bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar150._12_4_ =
                 (uint)bVar9 * ((uint)bVar12 * auVar112._12_4_ | !bVar12 * uVar159) |
                 !bVar9 * auVar150._12_4_;
            bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar150._16_4_ =
                 (uint)bVar9 * ((uint)bVar13 * auVar112._16_4_ | !bVar13 * uVar160) |
                 !bVar9 * auVar150._16_4_;
            bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar150._20_4_ =
                 (uint)bVar9 * ((uint)bVar14 * auVar112._20_4_ | !bVar14 * uVar161) |
                 !bVar9 * auVar150._20_4_;
            bVar9 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar150._24_4_ =
                 (uint)bVar9 * ((uint)bVar15 * auVar112._24_4_ | !bVar15 * uVar162) |
                 !bVar9 * auVar150._24_4_;
            bVar9 = SUB81(uVar85 >> 7,0);
            auVar150._28_4_ =
                 (uint)bVar9 * ((uint)bVar16 * auVar112._28_4_ | !bVar16 * uVar163) |
                 !bVar9 * auVar150._28_4_;
            bVar79 = (~bVar80 | bVar83) & bVar79;
          }
        }
        auVar300 = ZEXT3264(local_820);
        auVar270._0_4_ = local_820._0_4_ * auVar183._0_4_;
        auVar270._4_4_ = local_820._4_4_ * auVar183._4_4_;
        auVar270._8_4_ = local_820._8_4_ * auVar183._8_4_;
        auVar270._12_4_ = local_820._12_4_ * auVar183._12_4_;
        auVar270._16_4_ = local_820._16_4_ * auVar183._16_4_;
        auVar270._20_4_ = local_820._20_4_ * auVar183._20_4_;
        auVar270._28_36_ = auVar183._28_36_;
        auVar270._24_4_ = local_820._24_4_ * auVar183._24_4_;
        auVar287 = ZEXT3264(local_800);
        auVar94 = vfmadd231ps_fma(auVar270._0_32_,local_800,auVar113);
        auVar282 = ZEXT3264(_local_7e0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),_local_7e0,auVar130);
        auVar295 = ZEXT3264(_local_8e0);
        _local_540 = _local_8e0;
        local_520 = vminps_avx(local_680,auVar149);
        auVar276._8_4_ = 0x7fffffff;
        auVar276._0_8_ = 0x7fffffff7fffffff;
        auVar276._12_4_ = 0x7fffffff;
        auVar276._16_4_ = 0x7fffffff;
        auVar276._20_4_ = 0x7fffffff;
        auVar276._24_4_ = 0x7fffffff;
        auVar276._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(ZEXT1632(auVar94),auVar276);
        local_6a0 = vmaxps_avx(_local_8e0,auVar150);
        auVar270 = ZEXT3264(local_6a0);
        auVar177._8_4_ = 0x3e99999a;
        auVar177._0_8_ = 0x3e99999a3e99999a;
        auVar177._12_4_ = 0x3e99999a;
        auVar177._16_4_ = 0x3e99999a;
        auVar177._20_4_ = 0x3e99999a;
        auVar177._24_4_ = 0x3e99999a;
        auVar177._28_4_ = 0x3e99999a;
        uVar24 = vcmpps_avx512vl(auVar112,auVar177,1);
        local_720._0_2_ = (short)uVar24;
        uVar24 = vcmpps_avx512vl(_local_8e0,local_520,2);
        bVar80 = (byte)uVar24 & bVar74;
        uVar26 = vcmpps_avx512vl(local_6a0,local_680,2);
        auVar304 = ZEXT3264(local_ae0);
        auVar305 = ZEXT3264(local_b00);
        auVar306 = ZEXT3264(local_b20);
        if ((bVar74 & ((byte)uVar26 | (byte)uVar24)) != 0) {
          auVar53._4_4_ = local_820._4_4_ * auVar293._4_4_;
          auVar53._0_4_ = local_820._0_4_ * auVar293._0_4_;
          auVar53._8_4_ = local_820._8_4_ * auVar293._8_4_;
          auVar53._12_4_ = local_820._12_4_ * auVar293._12_4_;
          auVar53._16_4_ = local_820._16_4_ * auVar293._16_4_;
          auVar53._20_4_ = local_820._20_4_ * auVar293._20_4_;
          auVar53._24_4_ = local_820._24_4_ * auVar293._24_4_;
          auVar53._28_4_ = 0x3e99999a;
          auVar94 = vfmadd213ps_fma(auVar131,local_800,auVar53);
          auVar94 = vfmadd213ps_fma(auVar115,_local_7e0,ZEXT1632(auVar94));
          auVar115 = vandps_avx(ZEXT1632(auVar94),auVar276);
          uVar24 = vcmpps_avx512vl(auVar115,auVar177,1);
          bVar83 = (byte)uVar24 | ~bVar79;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar115 = vpblendmd_avx512vl(auVar178,auVar39);
          local_640._0_4_ = (uint)(bVar83 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
          bVar9 = (bool)(bVar83 >> 1 & 1);
          local_640._4_4_ = (uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 2 & 1);
          local_640._8_4_ = (uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 3 & 1);
          local_640._12_4_ = (uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 4 & 1);
          local_640._16_4_ = (uint)bVar9 * auVar115._16_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 5 & 1);
          local_640._20_4_ = (uint)bVar9 * auVar115._20_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 6 & 1);
          local_640._24_4_ = (uint)bVar9 * auVar115._24_4_ | (uint)!bVar9 * 2;
          local_640._28_4_ = (uint)(bVar83 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2;
          local_6c0 = vpbroadcastd_avx512vl();
          uVar24 = vpcmpd_avx512vl(local_6c0,local_640,5);
          bVar83 = (byte)uVar24 & bVar80;
          if (bVar83 == 0) {
            auVar180._4_4_ = uVar87;
            auVar180._0_4_ = uVar87;
            auVar180._8_4_ = uVar87;
            auVar180._12_4_ = uVar87;
            auVar180._16_4_ = uVar87;
            auVar180._20_4_ = uVar87;
            auVar180._24_4_ = uVar87;
            auVar180._28_4_ = uVar87;
          }
          else {
            local_660 = local_6a0;
            auVar95 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar94 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar23 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar96 = vminps_avx(auVar95,auVar23);
            auVar95 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar23 = vmaxps_avx(auVar94,auVar95);
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar96,auVar218);
            auVar95 = vandps_avx(auVar23,auVar218);
            auVar94 = vmaxps_avx(auVar94,auVar95);
            auVar95 = vmovshdup_avx(auVar94);
            auVar95 = vmaxss_avx(auVar95,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar95);
            local_a60._0_4_ = auVar94._0_4_ * 1.9073486e-06;
            local_940 = vshufps_avx(auVar23,auVar23,0xff);
            local_700 = (float)local_8e0._0_4_ + (float)local_a00._0_4_;
            fStack_6fc = (float)local_8e0._4_4_ + (float)local_a00._4_4_;
            fStack_6f8 = fStack_8d8 + fStack_9f8;
            fStack_6f4 = fStack_8d4 + fStack_9f4;
            fStack_6f0 = fStack_8d0 + fStack_9f0;
            fStack_6ec = fStack_8cc + fStack_9ec;
            fStack_6e8 = fStack_8c8 + fStack_9e8;
            fStack_6e4 = fStack_8c4 + fStack_9e4;
            do {
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar179,_local_8e0);
              auVar151._0_4_ =
                   (uint)(bVar83 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 1 & 1);
              auVar151._4_4_ = (uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 2 & 1);
              auVar151._8_4_ = (uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 3 & 1);
              auVar151._12_4_ = (uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 4 & 1);
              auVar151._16_4_ = (uint)bVar9 * auVar115._16_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 5 & 1);
              auVar151._20_4_ = (uint)bVar9 * auVar115._20_4_ | (uint)!bVar9 * 0x7f800000;
              auVar151._24_4_ =
                   (uint)(bVar83 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar83 >> 6) * 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar115 = vshufps_avx(auVar151,auVar151,0xb1);
              auVar115 = vminps_avx(auVar151,auVar115);
              auVar112 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar112);
              auVar112 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar112);
              uVar24 = vcmpps_avx512vl(auVar151,auVar115,0);
              bVar75 = (byte)uVar24 & bVar83;
              bVar76 = bVar83;
              if (bVar75 != 0) {
                bVar76 = bVar75;
              }
              iVar28 = 0;
              for (uVar87 = (uint)bVar76; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar28 = iVar28 + 1;
              }
              uVar87 = *(uint *)(local_540 + (uint)(iVar28 << 2));
              fVar283 = auVar91._0_4_;
              auVar94 = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar28 << 2)));
              if ((float)local_a20._0_4_ < 0.0) {
                local_a80._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar28 << 2)));
                fVar283 = sqrtf((float)local_a20._0_4_);
                auVar94 = local_a80._0_16_;
              }
              auVar94 = vinsertps_avx(ZEXT416(uVar87),auVar94,0x10);
              auVar292 = ZEXT1664(auVar94);
              lVar84 = 5;
              do {
                uVar191 = auVar292._0_4_;
                auVar169._4_4_ = uVar191;
                auVar169._0_4_ = uVar191;
                auVar169._8_4_ = uVar191;
                auVar169._12_4_ = uVar191;
                auVar94 = vfmadd132ps_fma(auVar169,ZEXT816(0) << 0x40,local_a10);
                auVar95 = vmovshdup_avx(auVar292._0_16_);
                fVar252 = auVar95._0_4_;
                fVar251 = 1.0 - fVar252;
                fVar290 = fVar251 * fVar251 * fVar251;
                fVar288 = fVar252 * fVar252;
                fVar253 = fVar288 * fVar252;
                auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar290),
                                          ZEXT416((uint)fVar253));
                fVar289 = fVar252 * fVar251;
                local_a80._0_16_ = ZEXT416((uint)fVar251);
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * fVar252 * 6.0)),
                                           ZEXT416((uint)(fVar289 * fVar251)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                          ZEXT416((uint)fVar290));
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * fVar251 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar289 * fVar252)));
                fVar290 = fVar290 * 0.16666667;
                fVar251 = (auVar23._0_4_ + auVar101._0_4_) * 0.16666667;
                fVar252 = (auVar96._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar253 = fVar253 * 0.16666667;
                auVar219._0_4_ = fVar253 * (float)local_9e0._0_4_;
                auVar219._4_4_ = fVar253 * (float)local_9e0._4_4_;
                auVar219._8_4_ = fVar253 * fStack_9d8;
                auVar219._12_4_ = fVar253 * fStack_9d4;
                auVar259._4_4_ = fVar252;
                auVar259._0_4_ = fVar252;
                auVar259._8_4_ = fVar252;
                auVar259._12_4_ = fVar252;
                auVar23 = vfmadd132ps_fma(auVar259,auVar219,local_9a0._0_16_);
                auVar220._4_4_ = fVar251;
                auVar220._0_4_ = fVar251;
                auVar220._8_4_ = fVar251;
                auVar220._12_4_ = fVar251;
                auVar23 = vfmadd132ps_fma(auVar220,auVar23,local_9c0._0_16_);
                auVar195._4_4_ = fVar290;
                auVar195._0_4_ = fVar290;
                auVar195._8_4_ = fVar290;
                auVar195._12_4_ = fVar290;
                auVar23 = vfmadd132ps_fma(auVar195,auVar23,local_980._0_16_);
                local_840._0_16_ = auVar23;
                auVar23 = vsubps_avx(auVar94,auVar23);
                auVar94 = vdpps_avx(auVar23,auVar23,0x7f);
                local_a40._0_16_ = auVar94;
                local_7c0 = auVar292;
                if (auVar94._0_4_ < 0.0) {
                  local_aa0._0_4_ = fVar288;
                  local_ac0._0_4_ = fVar289;
                  auVar282._0_4_ = sqrtf(auVar94._0_4_);
                  auVar282._4_60_ = extraout_var;
                  auVar94 = auVar282._0_16_;
                  fVar289 = (float)local_ac0._0_4_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  local_aa0._0_4_ = fVar288;
                }
                local_860._4_4_ = local_a80._0_4_;
                local_860._0_4_ = local_860._4_4_;
                fStack_858 = (float)local_860._4_4_;
                fStack_854 = (float)local_860._4_4_;
                auVar101 = vfnmsub213ss_fma(auVar95,auVar95,ZEXT416((uint)(fVar289 * 4.0)));
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * 4.0)),local_a80._0_16_,
                                          local_a80._0_16_);
                fVar288 = (float)local_860._4_4_ * -(float)local_860._4_4_ * 0.5;
                fVar289 = auVar101._0_4_ * 0.5;
                fVar290 = auVar96._0_4_ * 0.5;
                local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
                auVar239._0_4_ = (float)local_aa0._0_4_ * (float)local_9e0._0_4_;
                auVar239._4_4_ = (float)local_aa0._0_4_ * (float)local_9e0._4_4_;
                auVar239._8_4_ = (float)local_aa0._0_4_ * fStack_9d8;
                auVar239._12_4_ = (float)local_aa0._0_4_ * fStack_9d4;
                auVar196._4_4_ = fVar290;
                auVar196._0_4_ = fVar290;
                auVar196._8_4_ = fVar290;
                auVar196._12_4_ = fVar290;
                auVar96 = vfmadd132ps_fma(auVar196,auVar239,local_9a0._0_16_);
                auVar221._4_4_ = fVar289;
                auVar221._0_4_ = fVar289;
                auVar221._8_4_ = fVar289;
                auVar221._12_4_ = fVar289;
                auVar96 = vfmadd132ps_fma(auVar221,auVar96,local_9c0._0_16_);
                auVar297._4_4_ = fVar288;
                auVar297._0_4_ = fVar288;
                auVar297._8_4_ = fVar288;
                auVar297._12_4_ = fVar288;
                _local_aa0 = vfmadd132ps_fma(auVar297,auVar96,local_980._0_16_);
                local_880._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
                auVar54._12_4_ = 0;
                auVar54._0_12_ = ZEXT812(0);
                fVar288 = local_880._0_4_;
                auVar96 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar288));
                fVar289 = auVar96._0_4_;
                local_8a0._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar288));
                auVar96 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
                local_8c0._0_4_ = auVar96._0_4_;
                local_ac0._0_4_ = auVar94._0_4_;
                if (fVar288 < -fVar288) {
                  fVar290 = sqrtf(fVar288);
                  auVar94 = ZEXT416((uint)local_ac0._0_4_);
                  auVar96 = _local_aa0;
                }
                else {
                  auVar96 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                  fVar290 = auVar96._0_4_;
                  auVar96 = _local_aa0;
                }
                fVar288 = fVar289 * 1.5 + fVar288 * -0.5 * fVar289 * fVar289 * fVar289;
                auVar170._0_4_ = auVar96._0_4_ * fVar288;
                auVar170._4_4_ = auVar96._4_4_ * fVar288;
                auVar170._8_4_ = auVar96._8_4_ * fVar288;
                auVar170._12_4_ = auVar96._12_4_ * fVar288;
                auVar101 = vdpps_avx(auVar23,auVar170,0x7f);
                fVar252 = auVar94._0_4_;
                fVar289 = auVar101._0_4_;
                auVar171._0_4_ = fVar289 * fVar289;
                auVar171._4_4_ = auVar101._4_4_ * auVar101._4_4_;
                auVar171._8_4_ = auVar101._8_4_ * auVar101._8_4_;
                auVar171._12_4_ = auVar101._12_4_ * auVar101._12_4_;
                auVar93 = vsubps_avx(local_a40._0_16_,auVar171);
                fVar251 = auVar93._0_4_;
                auVar197._4_12_ = ZEXT812(0) << 0x20;
                auVar197._0_4_ = fVar251;
                auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
                auVar98 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
                auVar99 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
                if (fVar251 < 0.0) {
                  local_900._0_4_ = fVar290;
                  local_920._0_4_ = auVar98._0_4_;
                  local_930._4_4_ = fVar288;
                  local_930._0_4_ = fVar288;
                  fStack_928 = fVar288;
                  fStack_924 = fVar288;
                  local_910 = auVar97;
                  fVar251 = sqrtf(fVar251);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar98 = ZEXT416((uint)local_920._0_4_);
                  auVar94 = ZEXT416((uint)local_ac0._0_4_);
                  auVar97 = local_910;
                  auVar96 = _local_aa0;
                  fVar288 = (float)local_930._0_4_;
                  fVar253 = (float)local_930._4_4_;
                  fVar254 = fStack_928;
                  fVar255 = fStack_924;
                  fVar290 = (float)local_900._0_4_;
                }
                else {
                  auVar93 = vsqrtss_avx(auVar93,auVar93);
                  fVar251 = auVar93._0_4_;
                  fVar253 = fVar288;
                  fVar254 = fVar288;
                  fVar255 = fVar288;
                }
                auVar300 = ZEXT1664(auVar96);
                auVar295 = ZEXT1664(local_a40._0_16_);
                auVar293 = ZEXT1664(auVar23);
                auVar304 = ZEXT3264(local_ae0);
                auVar305 = ZEXT3264(local_b00);
                auVar306 = ZEXT3264(local_b20);
                auVar307 = ZEXT3264(local_b40);
                auVar308 = ZEXT3264(local_b60);
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar95);
                auVar102 = vfmadd213ss_fma(auVar95,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
                auVar104 = local_7c0._0_16_;
                auVar95 = vshufps_avx(auVar104,auVar104,0x55);
                auVar222._0_4_ = auVar95._0_4_ * (float)local_9e0._0_4_;
                auVar222._4_4_ = auVar95._4_4_ * (float)local_9e0._4_4_;
                auVar222._8_4_ = auVar95._8_4_ * fStack_9d8;
                auVar222._12_4_ = auVar95._12_4_ * fStack_9d4;
                auVar240._0_4_ = auVar102._0_4_;
                auVar240._4_4_ = auVar240._0_4_;
                auVar240._8_4_ = auVar240._0_4_;
                auVar240._12_4_ = auVar240._0_4_;
                auVar95 = vfmadd132ps_fma(auVar240,auVar222,local_9a0._0_16_);
                auVar198._0_4_ = auVar93._0_4_;
                auVar198._4_4_ = auVar198._0_4_;
                auVar198._8_4_ = auVar198._0_4_;
                auVar198._12_4_ = auVar198._0_4_;
                auVar95 = vfmadd132ps_fma(auVar198,auVar95,local_9c0._0_16_);
                auVar95 = vfmadd132ps_fma(_local_860,auVar95,local_980._0_16_);
                auVar199._0_4_ = auVar95._0_4_ * (float)local_880._0_4_;
                auVar199._4_4_ = auVar95._4_4_ * (float)local_880._0_4_;
                auVar199._8_4_ = auVar95._8_4_ * (float)local_880._0_4_;
                auVar199._12_4_ = auVar95._12_4_ * (float)local_880._0_4_;
                auVar95 = vdpps_avx(auVar96,auVar95,0x7f);
                fVar261 = auVar95._0_4_;
                auVar223._0_4_ = auVar96._0_4_ * fVar261;
                auVar223._4_4_ = auVar96._4_4_ * fVar261;
                auVar223._8_4_ = auVar96._8_4_ * fVar261;
                auVar223._12_4_ = auVar96._12_4_ * fVar261;
                auVar95 = vsubps_avx(auVar199,auVar223);
                fVar261 = (float)local_8c0._0_4_ * (float)local_8a0._0_4_;
                auVar102 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(local_7c0._0_4_ * fVar283 * 1.9073486e-06)));
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar100 = vxorps_avx512vl(auVar96,auVar30);
                auVar200._0_4_ = fVar288 * auVar95._0_4_ * fVar261;
                auVar200._4_4_ = fVar253 * auVar95._4_4_ * fVar261;
                auVar200._8_4_ = fVar254 * auVar95._8_4_ * fVar261;
                auVar200._12_4_ = fVar255 * auVar95._12_4_ * fVar261;
                auVar95 = vdpps_avx(auVar100,auVar170,0x7f);
                auVar93 = vfmadd213ss_fma(auVar94,ZEXT416((uint)local_a60._0_4_),auVar102);
                auVar94 = vdpps_avx(auVar23,auVar200,0x7f);
                auVar103 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),
                                           ZEXT416((uint)((float)local_a60._0_4_ / fVar290)),auVar93
                                          );
                fVar288 = auVar95._0_4_ + auVar94._0_4_;
                auVar94 = vdpps_avx(local_a10,auVar170,0x7f);
                auVar95 = vdpps_avx(auVar23,auVar100,0x7f);
                auVar93 = vmulss_avx512f(auVar99,auVar97);
                auVar99 = vaddss_avx512f(auVar98,ZEXT416((uint)(auVar93._0_4_ *
                                                               auVar97._0_4_ * auVar97._0_4_)));
                auVar93 = vdpps_avx(auVar23,local_a10,0x7f);
                auVar98 = vfnmadd231ss_fma(auVar95,auVar101,ZEXT416((uint)fVar288));
                auVar93 = vfnmadd231ss_fma(auVar93,auVar101,auVar94);
                auVar95 = vpermilps_avx(local_840._0_16_,0xff);
                fVar251 = fVar251 - auVar95._0_4_;
                auVar97 = vshufps_avx(auVar96,auVar96,0xff);
                auVar95 = vfmsub213ss_fma(auVar98,auVar99,auVar97);
                auVar285._8_4_ = 0x80000000;
                auVar285._0_8_ = 0x8000000080000000;
                auVar285._12_4_ = 0x80000000;
                auVar287 = ZEXT1664(auVar285);
                auVar279._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
                auVar279._8_4_ = auVar95._8_4_ ^ 0x80000000;
                auVar279._12_4_ = auVar95._12_4_ ^ 0x80000000;
                auVar282 = ZEXT1664(auVar279);
                auVar93 = ZEXT416((uint)(auVar93._0_4_ * auVar99._0_4_));
                auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar95._0_4_)),
                                          ZEXT416((uint)fVar288),auVar93);
                auVar95 = vinsertps_avx(auVar279,auVar93,0x1c);
                auVar268._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar268._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar268._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar93 = vinsertps_avx(ZEXT416((uint)fVar288),auVar268,0x10);
                auVar241._0_4_ = auVar98._0_4_;
                auVar241._4_4_ = auVar241._0_4_;
                auVar241._8_4_ = auVar241._0_4_;
                auVar241._12_4_ = auVar241._0_4_;
                auVar94 = vdivps_avx(auVar95,auVar241);
                auVar95 = vdivps_avx(auVar93,auVar241);
                auVar242._0_4_ = fVar289 * auVar94._0_4_ + fVar251 * auVar95._0_4_;
                auVar242._4_4_ = fVar289 * auVar94._4_4_ + fVar251 * auVar95._4_4_;
                auVar242._8_4_ = fVar289 * auVar94._8_4_ + fVar251 * auVar95._8_4_;
                auVar242._12_4_ = fVar289 * auVar94._12_4_ + fVar251 * auVar95._12_4_;
                auVar94 = vsubps_avx(auVar104,auVar242);
                auVar292 = ZEXT1664(auVar94);
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(auVar101,auVar31);
                if (auVar95._0_4_ < auVar103._0_4_) {
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ + auVar102._0_4_)),
                                            local_940,ZEXT416(0x36000000));
                  auVar32._8_4_ = 0x7fffffff;
                  auVar32._0_8_ = 0x7fffffff7fffffff;
                  auVar32._12_4_ = 0x7fffffff;
                  auVar101 = vandps_avx512vl(ZEXT416((uint)fVar251),auVar32);
                  if (auVar101._0_4_ < auVar95._0_4_) {
                    fVar283 = auVar94._0_4_ + (float)local_950._0_4_;
                    if ((fVar283 < fVar184) ||
                       (fVar288 = *(float *)(ray + k * 4 + 0x200), fVar288 < fVar283)) break;
                    auVar95 = vmovshdup_avx(auVar94);
                    fVar289 = auVar95._0_4_;
                    if ((fVar289 < 0.0) || (1.0 < fVar289)) break;
                    auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a40._0_4_));
                    fVar290 = auVar95._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar77].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    fVar290 = fVar290 * 1.5 + local_a40._0_4_ * -0.5 * fVar290 * fVar290 * fVar290;
                    auVar243._0_4_ = auVar23._0_4_ * fVar290;
                    auVar243._4_4_ = auVar23._4_4_ * fVar290;
                    auVar243._8_4_ = auVar23._8_4_ * fVar290;
                    auVar243._12_4_ = auVar23._12_4_ * fVar290;
                    auVar97 = vfmadd213ps_fma(auVar97,auVar243,auVar96);
                    auVar95 = vshufps_avx(auVar243,auVar243,0xc9);
                    auVar101 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar244._0_4_ = auVar243._0_4_ * auVar101._0_4_;
                    auVar244._4_4_ = auVar243._4_4_ * auVar101._4_4_;
                    auVar244._8_4_ = auVar243._8_4_ * auVar101._8_4_;
                    auVar244._12_4_ = auVar243._12_4_ * auVar101._12_4_;
                    auVar93 = vfmsub231ps_fma(auVar244,auVar96,auVar95);
                    auVar95 = vshufps_avx(auVar93,auVar93,0xc9);
                    auVar101 = vshufps_avx(auVar97,auVar97,0xc9);
                    auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                    auVar201._0_4_ = auVar97._0_4_ * auVar93._0_4_;
                    auVar201._4_4_ = auVar97._4_4_ * auVar93._4_4_;
                    auVar201._8_4_ = auVar97._8_4_ * auVar93._8_4_;
                    auVar201._12_4_ = auVar97._12_4_ * auVar93._12_4_;
                    auVar95 = vfmsub231ps_fma(auVar201,auVar95,auVar101);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar283;
                      uVar191 = vextractps_avx(auVar95,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar191;
                      uVar191 = vextractps_avx(auVar95,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar191;
                      *(int *)(ray + k * 4 + 0x380) = auVar95._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar289;
                      *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                      *(int *)(ray + k * 4 + 0x440) = (int)local_a48;
                      *(uint *)(ray + k * 4 + 0x480) = uVar77;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar7 = context->user;
                    auVar183 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar183,auVar292);
                    auVar183 = vpermps_avx512f(auVar183,ZEXT1664(auVar95));
                    auVar270 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar270,ZEXT1664(auVar95));
                    local_380 = vbroadcastss_avx512f(auVar95);
                    local_400[0] = (RTCHitN)auVar183[0];
                    local_400[1] = (RTCHitN)auVar183[1];
                    local_400[2] = (RTCHitN)auVar183[2];
                    local_400[3] = (RTCHitN)auVar183[3];
                    local_400[4] = (RTCHitN)auVar183[4];
                    local_400[5] = (RTCHitN)auVar183[5];
                    local_400[6] = (RTCHitN)auVar183[6];
                    local_400[7] = (RTCHitN)auVar183[7];
                    local_400[8] = (RTCHitN)auVar183[8];
                    local_400[9] = (RTCHitN)auVar183[9];
                    local_400[10] = (RTCHitN)auVar183[10];
                    local_400[0xb] = (RTCHitN)auVar183[0xb];
                    local_400[0xc] = (RTCHitN)auVar183[0xc];
                    local_400[0xd] = (RTCHitN)auVar183[0xd];
                    local_400[0xe] = (RTCHitN)auVar183[0xe];
                    local_400[0xf] = (RTCHitN)auVar183[0xf];
                    local_400[0x10] = (RTCHitN)auVar183[0x10];
                    local_400[0x11] = (RTCHitN)auVar183[0x11];
                    local_400[0x12] = (RTCHitN)auVar183[0x12];
                    local_400[0x13] = (RTCHitN)auVar183[0x13];
                    local_400[0x14] = (RTCHitN)auVar183[0x14];
                    local_400[0x15] = (RTCHitN)auVar183[0x15];
                    local_400[0x16] = (RTCHitN)auVar183[0x16];
                    local_400[0x17] = (RTCHitN)auVar183[0x17];
                    local_400[0x18] = (RTCHitN)auVar183[0x18];
                    local_400[0x19] = (RTCHitN)auVar183[0x19];
                    local_400[0x1a] = (RTCHitN)auVar183[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar183[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar183[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar183[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar183[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar183[0x1f];
                    local_400[0x20] = (RTCHitN)auVar183[0x20];
                    local_400[0x21] = (RTCHitN)auVar183[0x21];
                    local_400[0x22] = (RTCHitN)auVar183[0x22];
                    local_400[0x23] = (RTCHitN)auVar183[0x23];
                    local_400[0x24] = (RTCHitN)auVar183[0x24];
                    local_400[0x25] = (RTCHitN)auVar183[0x25];
                    local_400[0x26] = (RTCHitN)auVar183[0x26];
                    local_400[0x27] = (RTCHitN)auVar183[0x27];
                    local_400[0x28] = (RTCHitN)auVar183[0x28];
                    local_400[0x29] = (RTCHitN)auVar183[0x29];
                    local_400[0x2a] = (RTCHitN)auVar183[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar183[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar183[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar183[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar183[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar183[0x2f];
                    local_400[0x30] = (RTCHitN)auVar183[0x30];
                    local_400[0x31] = (RTCHitN)auVar183[0x31];
                    local_400[0x32] = (RTCHitN)auVar183[0x32];
                    local_400[0x33] = (RTCHitN)auVar183[0x33];
                    local_400[0x34] = (RTCHitN)auVar183[0x34];
                    local_400[0x35] = (RTCHitN)auVar183[0x35];
                    local_400[0x36] = (RTCHitN)auVar183[0x36];
                    local_400[0x37] = (RTCHitN)auVar183[0x37];
                    local_400[0x38] = (RTCHitN)auVar183[0x38];
                    local_400[0x39] = (RTCHitN)auVar183[0x39];
                    local_400[0x3a] = (RTCHitN)auVar183[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar183[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar183[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar183[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar183[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar183[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar183 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar183);
                    auVar115 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                    local_a50[3] = auVar115;
                    local_a50[2] = auVar115;
                    local_a50[1] = auVar115;
                    *local_a50 = auVar115;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar7->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar7->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar283;
                    auVar183 = vmovdqa64_avx512f(local_4c0);
                    local_780 = vmovdqa64_avx512f(auVar183);
                    local_b90.valid = (int *)local_780;
                    local_b90.geometryUserPtr = pGVar3->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = local_400;
                    local_b90.N = 0x10;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar282 = ZEXT1664(auVar279);
                      auVar287 = ZEXT1664(auVar285);
                      auVar292 = ZEXT1664(auVar94);
                      auVar293 = ZEXT1664(auVar23);
                      auVar295 = ZEXT1664(local_a40._0_16_);
                      auVar300 = ZEXT1664(auVar96);
                      (*pGVar3->intersectionFilterN)(&local_b90);
                      auVar308 = ZEXT3264(local_b60);
                      auVar307 = ZEXT3264(local_b40);
                      auVar306 = ZEXT3264(local_b20);
                      auVar305 = ZEXT3264(local_b00);
                      auVar304 = ZEXT3264(local_ae0);
                      auVar183 = vmovdqa64_avx512f(local_780);
                    }
                    uVar24 = vptestmd_avx512f(auVar183,auVar183);
                    if ((short)uVar24 != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar287 = ZEXT1664(auVar287._0_16_);
                        auVar292 = ZEXT1664(auVar292._0_16_);
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        auVar295 = ZEXT1664(auVar295._0_16_);
                        auVar300 = ZEXT1664(auVar300._0_16_);
                        (*p_Var8)(&local_b90);
                        auVar308 = ZEXT3264(local_b60);
                        auVar307 = ZEXT3264(local_b40);
                        auVar306 = ZEXT3264(local_b20);
                        auVar305 = ZEXT3264(local_b00);
                        auVar304 = ZEXT3264(local_ae0);
                        auVar183 = vmovdqa64_avx512f(local_780);
                      }
                      uVar85 = vptestmd_avx512f(auVar183,auVar183);
                      if ((short)uVar85 != 0) {
                        iVar56 = *(int *)(local_b90.hit + 4);
                        iVar57 = *(int *)(local_b90.hit + 8);
                        iVar58 = *(int *)(local_b90.hit + 0xc);
                        iVar59 = *(int *)(local_b90.hit + 0x10);
                        iVar60 = *(int *)(local_b90.hit + 0x14);
                        iVar61 = *(int *)(local_b90.hit + 0x18);
                        iVar62 = *(int *)(local_b90.hit + 0x1c);
                        iVar63 = *(int *)(local_b90.hit + 0x20);
                        iVar64 = *(int *)(local_b90.hit + 0x24);
                        iVar65 = *(int *)(local_b90.hit + 0x28);
                        iVar66 = *(int *)(local_b90.hit + 0x2c);
                        iVar67 = *(int *)(local_b90.hit + 0x30);
                        iVar68 = *(int *)(local_b90.hit + 0x34);
                        iVar69 = *(int *)(local_b90.hit + 0x38);
                        iVar70 = *(int *)(local_b90.hit + 0x3c);
                        bVar76 = (byte)uVar85;
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar75 = (byte)(uVar85 >> 8);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x300) =
                             (uint)(bVar76 & 1) * *(int *)local_b90.hit |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x300);
                        *(uint *)(local_b90.ray + 0x304) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x304);
                        *(uint *)(local_b90.ray + 0x308) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x308)
                        ;
                        *(uint *)(local_b90.ray + 0x30c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x30c)
                        ;
                        *(uint *)(local_b90.ray + 0x310) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x310)
                        ;
                        *(uint *)(local_b90.ray + 0x314) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x314)
                        ;
                        *(uint *)(local_b90.ray + 0x318) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x318)
                        ;
                        *(uint *)(local_b90.ray + 0x31c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x31c)
                        ;
                        *(uint *)(local_b90.ray + 800) =
                             (uint)(bVar75 & 1) * iVar63 |
                             (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 800);
                        *(uint *)(local_b90.ray + 0x324) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x324)
                        ;
                        *(uint *)(local_b90.ray + 0x328) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x328)
                        ;
                        *(uint *)(local_b90.ray + 0x32c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x32c)
                        ;
                        *(uint *)(local_b90.ray + 0x330) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x330)
                        ;
                        *(uint *)(local_b90.ray + 0x334) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x334)
                        ;
                        *(uint *)(local_b90.ray + 0x338) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x338)
                        ;
                        *(uint *)(local_b90.ray + 0x33c) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x33c)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0x44);
                        iVar57 = *(int *)(local_b90.hit + 0x48);
                        iVar58 = *(int *)(local_b90.hit + 0x4c);
                        iVar59 = *(int *)(local_b90.hit + 0x50);
                        iVar60 = *(int *)(local_b90.hit + 0x54);
                        iVar61 = *(int *)(local_b90.hit + 0x58);
                        iVar62 = *(int *)(local_b90.hit + 0x5c);
                        iVar63 = *(int *)(local_b90.hit + 0x60);
                        iVar64 = *(int *)(local_b90.hit + 100);
                        iVar65 = *(int *)(local_b90.hit + 0x68);
                        iVar66 = *(int *)(local_b90.hit + 0x6c);
                        iVar67 = *(int *)(local_b90.hit + 0x70);
                        iVar68 = *(int *)(local_b90.hit + 0x74);
                        iVar69 = *(int *)(local_b90.hit + 0x78);
                        iVar70 = *(int *)(local_b90.hit + 0x7c);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x340) =
                             (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0x40) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x340);
                        *(uint *)(local_b90.ray + 0x344) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x344);
                        *(uint *)(local_b90.ray + 0x348) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x348)
                        ;
                        *(uint *)(local_b90.ray + 0x34c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x34c)
                        ;
                        *(uint *)(local_b90.ray + 0x350) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x350)
                        ;
                        *(uint *)(local_b90.ray + 0x354) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x354)
                        ;
                        *(uint *)(local_b90.ray + 0x358) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x358)
                        ;
                        *(uint *)(local_b90.ray + 0x35c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x35c)
                        ;
                        *(uint *)(local_b90.ray + 0x360) =
                             (uint)(bVar75 & 1) * iVar63 |
                             (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x360);
                        *(uint *)(local_b90.ray + 0x364) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x364)
                        ;
                        *(uint *)(local_b90.ray + 0x368) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x368)
                        ;
                        *(uint *)(local_b90.ray + 0x36c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x36c)
                        ;
                        *(uint *)(local_b90.ray + 0x370) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x370)
                        ;
                        *(uint *)(local_b90.ray + 0x374) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x374)
                        ;
                        *(uint *)(local_b90.ray + 0x378) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x378)
                        ;
                        *(uint *)(local_b90.ray + 0x37c) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x37c)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0x84);
                        iVar57 = *(int *)(local_b90.hit + 0x88);
                        iVar58 = *(int *)(local_b90.hit + 0x8c);
                        iVar59 = *(int *)(local_b90.hit + 0x90);
                        iVar60 = *(int *)(local_b90.hit + 0x94);
                        iVar61 = *(int *)(local_b90.hit + 0x98);
                        iVar62 = *(int *)(local_b90.hit + 0x9c);
                        iVar63 = *(int *)(local_b90.hit + 0xa0);
                        iVar64 = *(int *)(local_b90.hit + 0xa4);
                        iVar65 = *(int *)(local_b90.hit + 0xa8);
                        iVar66 = *(int *)(local_b90.hit + 0xac);
                        iVar67 = *(int *)(local_b90.hit + 0xb0);
                        iVar68 = *(int *)(local_b90.hit + 0xb4);
                        iVar69 = *(int *)(local_b90.hit + 0xb8);
                        iVar70 = *(int *)(local_b90.hit + 0xbc);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x380) =
                             (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0x80) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x380);
                        *(uint *)(local_b90.ray + 900) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 900);
                        *(uint *)(local_b90.ray + 0x388) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x388)
                        ;
                        *(uint *)(local_b90.ray + 0x38c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x38c)
                        ;
                        *(uint *)(local_b90.ray + 0x390) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x390)
                        ;
                        *(uint *)(local_b90.ray + 0x394) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x394)
                        ;
                        *(uint *)(local_b90.ray + 0x398) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x398)
                        ;
                        *(uint *)(local_b90.ray + 0x39c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x39c)
                        ;
                        *(uint *)(local_b90.ray + 0x3a0) =
                             (uint)(bVar75 & 1) * iVar63 |
                             (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x3a0);
                        *(uint *)(local_b90.ray + 0x3a4) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3a4)
                        ;
                        *(uint *)(local_b90.ray + 0x3a8) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x3a8)
                        ;
                        *(uint *)(local_b90.ray + 0x3ac) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3ac)
                        ;
                        *(uint *)(local_b90.ray + 0x3b0) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3b0)
                        ;
                        *(uint *)(local_b90.ray + 0x3b4) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x3b4)
                        ;
                        *(uint *)(local_b90.ray + 0x3b8) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x3b8)
                        ;
                        *(uint *)(local_b90.ray + 0x3bc) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x3bc)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0xc4);
                        iVar57 = *(int *)(local_b90.hit + 200);
                        iVar58 = *(int *)(local_b90.hit + 0xcc);
                        iVar59 = *(int *)(local_b90.hit + 0xd0);
                        iVar60 = *(int *)(local_b90.hit + 0xd4);
                        iVar61 = *(int *)(local_b90.hit + 0xd8);
                        iVar62 = *(int *)(local_b90.hit + 0xdc);
                        iVar63 = *(int *)(local_b90.hit + 0xe0);
                        iVar64 = *(int *)(local_b90.hit + 0xe4);
                        iVar65 = *(int *)(local_b90.hit + 0xe8);
                        iVar66 = *(int *)(local_b90.hit + 0xec);
                        iVar67 = *(int *)(local_b90.hit + 0xf0);
                        iVar68 = *(int *)(local_b90.hit + 0xf4);
                        iVar69 = *(int *)(local_b90.hit + 0xf8);
                        iVar70 = *(int *)(local_b90.hit + 0xfc);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x3c0) =
                             (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0xc0) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x3c0);
                        *(uint *)(local_b90.ray + 0x3c4) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x3c4);
                        *(uint *)(local_b90.ray + 0x3c8) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x3c8)
                        ;
                        *(uint *)(local_b90.ray + 0x3cc) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x3cc)
                        ;
                        *(uint *)(local_b90.ray + 0x3d0) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x3d0)
                        ;
                        *(uint *)(local_b90.ray + 0x3d4) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x3d4)
                        ;
                        *(uint *)(local_b90.ray + 0x3d8) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x3d8)
                        ;
                        *(uint *)(local_b90.ray + 0x3dc) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x3dc)
                        ;
                        *(uint *)(local_b90.ray + 0x3e0) =
                             (uint)(bVar75 & 1) * iVar63 |
                             (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x3e0);
                        *(uint *)(local_b90.ray + 0x3e4) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3e4)
                        ;
                        *(uint *)(local_b90.ray + 1000) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 1000);
                        *(uint *)(local_b90.ray + 0x3ec) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3ec)
                        ;
                        *(uint *)(local_b90.ray + 0x3f0) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3f0)
                        ;
                        *(uint *)(local_b90.ray + 0x3f4) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x3f4)
                        ;
                        *(uint *)(local_b90.ray + 0x3f8) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x3f8)
                        ;
                        *(uint *)(local_b90.ray + 0x3fc) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x3fc)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0x104);
                        iVar57 = *(int *)(local_b90.hit + 0x108);
                        iVar58 = *(int *)(local_b90.hit + 0x10c);
                        iVar59 = *(int *)(local_b90.hit + 0x110);
                        iVar60 = *(int *)(local_b90.hit + 0x114);
                        iVar61 = *(int *)(local_b90.hit + 0x118);
                        iVar62 = *(int *)(local_b90.hit + 0x11c);
                        iVar63 = *(int *)(local_b90.hit + 0x120);
                        iVar64 = *(int *)(local_b90.hit + 0x124);
                        iVar65 = *(int *)(local_b90.hit + 0x128);
                        iVar66 = *(int *)(local_b90.hit + 300);
                        iVar67 = *(int *)(local_b90.hit + 0x130);
                        iVar68 = *(int *)(local_b90.hit + 0x134);
                        iVar69 = *(int *)(local_b90.hit + 0x138);
                        iVar70 = *(int *)(local_b90.hit + 0x13c);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x400) =
                             (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0x100) |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x400);
                        *(uint *)(local_b90.ray + 0x404) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x404);
                        *(uint *)(local_b90.ray + 0x408) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x408)
                        ;
                        *(uint *)(local_b90.ray + 0x40c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x40c)
                        ;
                        *(uint *)(local_b90.ray + 0x410) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x410)
                        ;
                        *(uint *)(local_b90.ray + 0x414) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x414)
                        ;
                        *(uint *)(local_b90.ray + 0x418) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x418)
                        ;
                        *(uint *)(local_b90.ray + 0x41c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x41c)
                        ;
                        *(uint *)(local_b90.ray + 0x420) =
                             (uint)(bVar75 & 1) * iVar63 |
                             (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x420);
                        *(uint *)(local_b90.ray + 0x424) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x424)
                        ;
                        *(uint *)(local_b90.ray + 0x428) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x428)
                        ;
                        *(uint *)(local_b90.ray + 0x42c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x42c)
                        ;
                        *(uint *)(local_b90.ray + 0x430) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x430)
                        ;
                        *(uint *)(local_b90.ray + 0x434) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x434)
                        ;
                        *(uint *)(local_b90.ray + 0x438) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x438)
                        ;
                        *(uint *)(local_b90.ray + 0x43c) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x43c)
                        ;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x140));
                        auVar183 = vmovdqu32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x180));
                        auVar183 = vmovdqu32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x1c0));
                        auVar183 = vmovdqa32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x200));
                        auVar183 = vmovdqa32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar183;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar288;
                    break;
                  }
                }
                lVar84 = lVar84 + -1;
              } while (lVar84 != 0);
              uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar180._4_4_ = uVar191;
              auVar180._0_4_ = uVar191;
              auVar180._8_4_ = uVar191;
              auVar180._12_4_ = uVar191;
              auVar180._16_4_ = uVar191;
              auVar180._20_4_ = uVar191;
              auVar180._24_4_ = uVar191;
              auVar180._28_4_ = uVar191;
              auVar71._4_4_ = fStack_6fc;
              auVar71._0_4_ = local_700;
              auVar71._8_4_ = fStack_6f8;
              auVar71._12_4_ = fStack_6f4;
              auVar71._16_4_ = fStack_6f0;
              auVar71._20_4_ = fStack_6ec;
              auVar71._24_4_ = fStack_6e8;
              auVar71._28_4_ = fStack_6e4;
              uVar24 = vcmpps_avx512vl(auVar180,auVar71,0xd);
              bVar83 = ~('\x01' << ((byte)iVar28 & 0x1f)) & bVar83 & (byte)uVar24;
            } while (bVar83 != 0);
            auVar270 = ZEXT3264(local_660);
          }
          bVar79 = local_720[0] | ~bVar79;
          auVar210._0_4_ = (float)local_a00._0_4_ + auVar270._0_4_;
          auVar210._4_4_ = (float)local_a00._4_4_ + auVar270._4_4_;
          auVar210._8_4_ = fStack_9f8 + auVar270._8_4_;
          auVar210._12_4_ = fStack_9f4 + auVar270._12_4_;
          auVar210._16_4_ = fStack_9f0 + auVar270._16_4_;
          auVar210._20_4_ = fStack_9ec + auVar270._20_4_;
          auVar210._24_4_ = fStack_9e8 + auVar270._24_4_;
          auVar210._28_4_ = fStack_9e4 + auVar270._28_4_;
          uVar24 = vcmpps_avx512vl(auVar210,auVar180,2);
          bVar74 = (byte)uVar26 & bVar74 & (byte)uVar24;
          auVar211._8_4_ = 2;
          auVar211._0_8_ = 0x200000002;
          auVar211._12_4_ = 2;
          auVar211._16_4_ = 2;
          auVar211._20_4_ = 2;
          auVar211._24_4_ = 2;
          auVar211._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar115 = vpblendmd_avx512vl(auVar211,auVar40);
          auVar152._0_4_ = (uint)(bVar79 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar9 = (bool)(bVar79 >> 1 & 1);
          auVar152._4_4_ = (uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar79 >> 2 & 1);
          auVar152._8_4_ = (uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar79 >> 3 & 1);
          auVar152._12_4_ = (uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar79 >> 4 & 1);
          auVar152._16_4_ = (uint)bVar9 * auVar115._16_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar79 >> 5 & 1);
          auVar152._20_4_ = (uint)bVar9 * auVar115._20_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar79 >> 6 & 1);
          auVar152._24_4_ = (uint)bVar9 * auVar115._24_4_ | (uint)!bVar9 * 2;
          auVar152._28_4_ = (uint)(bVar79 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
          uVar24 = vpcmpd_avx512vl(local_6c0,auVar152,5);
          bVar79 = (byte)uVar24 & bVar74;
          fVar283 = (float)local_a00._0_4_;
          fVar288 = (float)local_a00._4_4_;
          fVar289 = fStack_9f8;
          fVar290 = fStack_9f4;
          fVar251 = fStack_9f0;
          fVar252 = fStack_9ec;
          fVar253 = fStack_9e8;
          fVar254 = fStack_9e4;
          if (bVar79 != 0) {
            auVar95 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar94 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar23 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar96 = vminps_avx(auVar95,auVar23);
            auVar95 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar23 = vmaxps_avx(auVar94,auVar95);
            auVar224._8_4_ = 0x7fffffff;
            auVar224._0_8_ = 0x7fffffff7fffffff;
            auVar224._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar96,auVar224);
            auVar95 = vandps_avx(auVar23,auVar224);
            auVar94 = vmaxps_avx(auVar94,auVar95);
            auVar95 = vmovshdup_avx(auVar94);
            auVar95 = vmaxss_avx(auVar95,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar95);
            fVar283 = auVar94._0_4_ * 1.9073486e-06;
            local_940 = vshufps_avx(auVar23,auVar23,0xff);
            local_700 = (float)local_a00._0_4_ + local_6a0._0_4_;
            fStack_6fc = (float)local_a00._4_4_ + local_6a0._4_4_;
            fStack_6f8 = fStack_9f8 + local_6a0._8_4_;
            fStack_6f4 = fStack_9f4 + local_6a0._12_4_;
            fStack_6f0 = fStack_9f0 + local_6a0._16_4_;
            fStack_6ec = fStack_9ec + local_6a0._20_4_;
            fStack_6e8 = fStack_9e8 + local_6a0._24_4_;
            fStack_6e4 = fStack_9e4 + local_6a0._28_4_;
            _local_8e0 = local_6a0;
            local_720 = auVar152;
            do {
              auVar181._8_4_ = 0x7f800000;
              auVar181._0_8_ = 0x7f8000007f800000;
              auVar181._12_4_ = 0x7f800000;
              auVar181._16_4_ = 0x7f800000;
              auVar181._20_4_ = 0x7f800000;
              auVar181._24_4_ = 0x7f800000;
              auVar181._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar181,_local_8e0);
              auVar153._0_4_ =
                   (uint)(bVar79 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
              bVar9 = (bool)(bVar79 >> 1 & 1);
              auVar153._4_4_ = (uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar79 >> 2 & 1);
              auVar153._8_4_ = (uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar79 >> 3 & 1);
              auVar153._12_4_ = (uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar79 >> 4 & 1);
              auVar153._16_4_ = (uint)bVar9 * auVar115._16_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar79 >> 5 & 1);
              auVar153._20_4_ = (uint)bVar9 * auVar115._20_4_ | (uint)!bVar9 * 0x7f800000;
              auVar153._24_4_ =
                   (uint)(bVar79 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar115 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar115 = vminps_avx(auVar153,auVar115);
              auVar112 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar112);
              auVar112 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar112);
              uVar24 = vcmpps_avx512vl(auVar153,auVar115,0);
              bVar76 = (byte)uVar24 & bVar79;
              bVar83 = bVar79;
              if (bVar76 != 0) {
                bVar83 = bVar76;
              }
              iVar28 = 0;
              for (uVar87 = (uint)bVar83; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar28 = iVar28 + 1;
              }
              uVar87 = *(uint *)(local_680 + (uint)(iVar28 << 2));
              fVar288 = auVar92._0_4_;
              auVar94 = ZEXT416(*(uint *)(local_500 + (uint)(iVar28 << 2)));
              if ((float)local_a20._0_4_ < 0.0) {
                local_a80._0_16_ = ZEXT416(*(uint *)(local_500 + (uint)(iVar28 << 2)));
                fVar288 = sqrtf((float)local_a20._0_4_);
                auVar94 = local_a80._0_16_;
              }
              auVar94 = vinsertps_avx(ZEXT416(uVar87),auVar94,0x10);
              auVar292 = ZEXT1664(auVar94);
              lVar84 = 5;
              do {
                uVar191 = auVar292._0_4_;
                auVar172._4_4_ = uVar191;
                auVar172._0_4_ = uVar191;
                auVar172._8_4_ = uVar191;
                auVar172._12_4_ = uVar191;
                auVar94 = vfmadd132ps_fma(auVar172,ZEXT816(0) << 0x40,local_a10);
                auVar95 = vmovshdup_avx(auVar292._0_16_);
                fVar253 = auVar95._0_4_;
                fVar252 = 1.0 - fVar253;
                fVar251 = fVar252 * fVar252 * fVar252;
                fVar289 = fVar253 * fVar253;
                fVar254 = fVar289 * fVar253;
                auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                          ZEXT416((uint)fVar254));
                fVar290 = fVar253 * fVar252;
                local_a80._0_16_ = ZEXT416((uint)fVar252);
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar290 * fVar253 * 6.0)),
                                           ZEXT416((uint)(fVar290 * fVar252)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar254),
                                          ZEXT416((uint)fVar251));
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar290 * fVar252 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar290 * fVar253)));
                fVar251 = fVar251 * 0.16666667;
                fVar252 = (auVar23._0_4_ + auVar101._0_4_) * 0.16666667;
                fVar253 = (auVar96._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar254 = fVar254 * 0.16666667;
                auVar225._0_4_ = fVar254 * (float)local_9e0._0_4_;
                auVar225._4_4_ = fVar254 * (float)local_9e0._4_4_;
                auVar225._8_4_ = fVar254 * fStack_9d8;
                auVar225._12_4_ = fVar254 * fStack_9d4;
                auVar260._4_4_ = fVar253;
                auVar260._0_4_ = fVar253;
                auVar260._8_4_ = fVar253;
                auVar260._12_4_ = fVar253;
                auVar23 = vfmadd132ps_fma(auVar260,auVar225,local_9a0._0_16_);
                auVar226._4_4_ = fVar252;
                auVar226._0_4_ = fVar252;
                auVar226._8_4_ = fVar252;
                auVar226._12_4_ = fVar252;
                auVar23 = vfmadd132ps_fma(auVar226,auVar23,local_9c0._0_16_);
                auVar202._4_4_ = fVar251;
                auVar202._0_4_ = fVar251;
                auVar202._8_4_ = fVar251;
                auVar202._12_4_ = fVar251;
                auVar23 = vfmadd132ps_fma(auVar202,auVar23,local_980._0_16_);
                local_840._0_16_ = auVar23;
                auVar23 = vsubps_avx(auVar94,auVar23);
                auVar94 = vdpps_avx(auVar23,auVar23,0x7f);
                local_a40._0_16_ = auVar94;
                local_7c0 = auVar292;
                if (auVar94._0_4_ < 0.0) {
                  local_aa0._0_4_ = fVar289;
                  local_ac0._0_4_ = fVar290;
                  auVar287._0_4_ = sqrtf(auVar94._0_4_);
                  auVar287._4_60_ = extraout_var_00;
                  auVar94 = auVar287._0_16_;
                  fVar290 = (float)local_ac0._0_4_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  local_aa0._0_4_ = fVar289;
                }
                local_860._4_4_ = local_a80._0_4_;
                local_860._0_4_ = local_860._4_4_;
                fStack_858 = (float)local_860._4_4_;
                fStack_854 = (float)local_860._4_4_;
                auVar101 = vfnmsub213ss_fma(auVar95,auVar95,ZEXT416((uint)(fVar290 * 4.0)));
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar290 * 4.0)),local_a80._0_16_,
                                          local_a80._0_16_);
                fVar289 = (float)local_860._4_4_ * -(float)local_860._4_4_ * 0.5;
                fVar290 = auVar101._0_4_ * 0.5;
                fVar251 = auVar96._0_4_ * 0.5;
                local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
                auVar245._0_4_ = (float)local_aa0._0_4_ * (float)local_9e0._0_4_;
                auVar245._4_4_ = (float)local_aa0._0_4_ * (float)local_9e0._4_4_;
                auVar245._8_4_ = (float)local_aa0._0_4_ * fStack_9d8;
                auVar245._12_4_ = (float)local_aa0._0_4_ * fStack_9d4;
                auVar203._4_4_ = fVar251;
                auVar203._0_4_ = fVar251;
                auVar203._8_4_ = fVar251;
                auVar203._12_4_ = fVar251;
                auVar96 = vfmadd132ps_fma(auVar203,auVar245,local_9a0._0_16_);
                auVar227._4_4_ = fVar290;
                auVar227._0_4_ = fVar290;
                auVar227._8_4_ = fVar290;
                auVar227._12_4_ = fVar290;
                auVar96 = vfmadd132ps_fma(auVar227,auVar96,local_9c0._0_16_);
                auVar298._4_4_ = fVar289;
                auVar298._0_4_ = fVar289;
                auVar298._8_4_ = fVar289;
                auVar298._12_4_ = fVar289;
                _local_aa0 = vfmadd132ps_fma(auVar298,auVar96,local_980._0_16_);
                local_880._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
                auVar55._12_4_ = 0;
                auVar55._0_12_ = ZEXT812(0);
                fVar289 = local_880._0_4_;
                auVar101 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar289));
                local_8a0._0_16_ = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar289));
                auVar96 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
                local_8c0._0_4_ = auVar96._0_4_;
                local_ac0._0_4_ = auVar94._0_4_;
                if (fVar289 < -fVar289) {
                  local_a60 = auVar101;
                  fVar290 = sqrtf(fVar289);
                  auVar94 = ZEXT416((uint)local_ac0._0_4_);
                  auVar96 = local_a60;
                  auVar93 = _local_aa0;
                }
                else {
                  auVar96 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                  fVar290 = auVar96._0_4_;
                  auVar96 = auVar101;
                  auVar93 = _local_aa0;
                }
                fVar251 = auVar96._0_4_;
                auVar99 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar101._0_4_ * 1.5 +
                                                   fVar289 * -0.5 * fVar251 * fVar251 * fVar251)));
                auVar98 = vmulps_avx512vl(auVar93,auVar99);
                auVar96 = vdpps_avx(auVar23,auVar98,0x7f);
                fVar289 = auVar94._0_4_ + 1.0;
                fVar251 = auVar96._0_4_;
                auVar173._0_4_ = fVar251 * fVar251;
                auVar173._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                auVar173._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                auVar173._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                auVar101 = vsubps_avx(local_a40._0_16_,auVar173);
                fVar252 = auVar101._0_4_;
                auVar204._4_12_ = ZEXT812(0) << 0x20;
                auVar204._0_4_ = fVar252;
                auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
                auVar102 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
                auVar103 = vmulss_avx512f(auVar101,ZEXT416(0xbf000000));
                if (fVar252 < 0.0) {
                  local_a60._0_4_ = fVar289;
                  local_910._0_4_ = auVar102._0_4_;
                  _local_930 = auVar99;
                  local_920 = auVar98;
                  local_900 = auVar97;
                  fVar252 = sqrtf(fVar252);
                  auVar103 = ZEXT416(auVar103._0_4_);
                  auVar102 = ZEXT416((uint)local_910._0_4_);
                  auVar94 = ZEXT416((uint)local_ac0._0_4_);
                  auVar97 = local_900;
                  auVar93 = _local_aa0;
                  fVar289 = (float)local_a60._0_4_;
                  auVar98 = local_920;
                  auVar99 = _local_930;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar101,auVar101);
                  fVar252 = auVar101._0_4_;
                }
                auVar300 = ZEXT1664(auVar93);
                auVar295 = ZEXT1664(local_a40._0_16_);
                auVar293 = ZEXT1664(auVar23);
                auVar304 = ZEXT3264(local_ae0);
                auVar305 = ZEXT3264(local_b00);
                auVar306 = ZEXT3264(local_b20);
                auVar307 = ZEXT3264(local_b40);
                auVar308 = ZEXT3264(local_b60);
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar95);
                auVar100 = vfmadd213ss_fma(auVar95,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
                auVar291 = local_7c0._0_16_;
                auVar95 = vshufps_avx(auVar291,auVar291,0x55);
                auVar228._0_4_ = auVar95._0_4_ * (float)local_9e0._0_4_;
                auVar228._4_4_ = auVar95._4_4_ * (float)local_9e0._4_4_;
                auVar228._8_4_ = auVar95._8_4_ * fStack_9d8;
                auVar228._12_4_ = auVar95._12_4_ * fStack_9d4;
                auVar246._0_4_ = auVar100._0_4_;
                auVar246._4_4_ = auVar246._0_4_;
                auVar246._8_4_ = auVar246._0_4_;
                auVar246._12_4_ = auVar246._0_4_;
                auVar95 = vfmadd132ps_fma(auVar246,auVar228,local_9a0._0_16_);
                auVar205._0_4_ = auVar101._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar95 = vfmadd132ps_fma(auVar205,auVar95,local_9c0._0_16_);
                auVar95 = vfmadd132ps_fma(_local_860,auVar95,local_980._0_16_);
                auVar206._0_4_ = auVar95._0_4_ * (float)local_880._0_4_;
                auVar206._4_4_ = auVar95._4_4_ * (float)local_880._0_4_;
                auVar206._8_4_ = auVar95._8_4_ * (float)local_880._0_4_;
                auVar206._12_4_ = auVar95._12_4_ * (float)local_880._0_4_;
                auVar95 = vdpps_avx(auVar93,auVar95,0x7f);
                fVar253 = auVar95._0_4_;
                auVar229._0_4_ = auVar93._0_4_ * fVar253;
                auVar229._4_4_ = auVar93._4_4_ * fVar253;
                auVar229._8_4_ = auVar93._8_4_ * fVar253;
                auVar229._12_4_ = auVar93._12_4_ * fVar253;
                auVar95 = vsubps_avx(auVar206,auVar229);
                fVar253 = (float)local_8c0._0_4_ * (float)local_8a0._0_4_;
                auVar100 = vmaxss_avx(ZEXT416((uint)fVar283),
                                      ZEXT416((uint)(local_7c0._0_4_ * fVar288 * 1.9073486e-06)));
                auVar207._0_4_ = auVar95._0_4_ * fVar253;
                auVar207._4_4_ = auVar95._4_4_ * fVar253;
                auVar207._8_4_ = auVar95._8_4_ * fVar253;
                auVar207._12_4_ = auVar95._12_4_ * fVar253;
                auVar33._8_4_ = 0x80000000;
                auVar33._0_8_ = 0x8000000080000000;
                auVar33._12_4_ = 0x80000000;
                auVar104 = vxorps_avx512vl(auVar93,auVar33);
                auVar99 = vmulps_avx512vl(auVar99,auVar207);
                auVar95 = vdpps_avx(auVar104,auVar98,0x7f);
                auVar101 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar283),auVar100);
                auVar94 = vdpps_avx(auVar23,auVar99,0x7f);
                auVar99 = vfmadd213ss_fma(ZEXT416((uint)fVar289),ZEXT416((uint)(fVar283 / fVar290)),
                                          auVar101);
                fVar289 = auVar95._0_4_ + auVar94._0_4_;
                auVar94 = vdpps_avx(local_a10,auVar98,0x7f);
                auVar95 = vdpps_avx(auVar23,auVar104,0x7f);
                auVar101 = vmulss_avx512f(auVar103,auVar97);
                auVar102 = vaddss_avx512f(auVar102,ZEXT416((uint)(auVar101._0_4_ *
                                                                 auVar97._0_4_ * auVar97._0_4_)));
                auVar101 = vdpps_avx(auVar23,local_a10,0x7f);
                auVar98 = vfnmadd231ss_fma(auVar95,auVar96,ZEXT416((uint)fVar289));
                auVar101 = vfnmadd231ss_fma(auVar101,auVar96,auVar94);
                auVar95 = vpermilps_avx(local_840._0_16_,0xff);
                fVar252 = fVar252 - auVar95._0_4_;
                auVar97 = vshufps_avx(auVar93,auVar93,0xff);
                auVar95 = vfmsub213ss_fma(auVar98,auVar102,auVar97);
                auVar286._8_4_ = 0x80000000;
                auVar286._0_8_ = 0x8000000080000000;
                auVar286._12_4_ = 0x80000000;
                auVar287 = ZEXT1664(auVar286);
                auVar280._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
                auVar280._8_4_ = auVar95._8_4_ ^ 0x80000000;
                auVar280._12_4_ = auVar95._12_4_ ^ 0x80000000;
                auVar282 = ZEXT1664(auVar280);
                auVar101 = ZEXT416((uint)(auVar101._0_4_ * auVar102._0_4_));
                auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar95._0_4_)),
                                          ZEXT416((uint)fVar289),auVar101);
                auVar95 = vinsertps_avx(auVar280,auVar101,0x1c);
                auVar269._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar269._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar269._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar101 = vinsertps_avx(ZEXT416((uint)fVar289),auVar269,0x10);
                auVar247._0_4_ = auVar98._0_4_;
                auVar247._4_4_ = auVar247._0_4_;
                auVar247._8_4_ = auVar247._0_4_;
                auVar247._12_4_ = auVar247._0_4_;
                auVar94 = vdivps_avx(auVar95,auVar247);
                auVar95 = vdivps_avx(auVar101,auVar247);
                auVar270 = ZEXT1664(CONCAT412(fVar252,CONCAT48(fVar252,CONCAT44(fVar252,fVar252))));
                auVar248._0_4_ = fVar251 * auVar94._0_4_ + fVar252 * auVar95._0_4_;
                auVar248._4_4_ = fVar251 * auVar94._4_4_ + fVar252 * auVar95._4_4_;
                auVar248._8_4_ = fVar251 * auVar94._8_4_ + fVar252 * auVar95._8_4_;
                auVar248._12_4_ = fVar251 * auVar94._12_4_ + fVar252 * auVar95._12_4_;
                auVar94 = vsubps_avx(auVar291,auVar248);
                auVar292 = ZEXT1664(auVar94);
                auVar34._8_4_ = 0x7fffffff;
                auVar34._0_8_ = 0x7fffffff7fffffff;
                auVar34._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(auVar96,auVar34);
                if (auVar95._0_4_ < auVar99._0_4_) {
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar99._0_4_ + auVar100._0_4_)),
                                            local_940,ZEXT416(0x36000000));
                  auVar35._8_4_ = 0x7fffffff;
                  auVar35._0_8_ = 0x7fffffff7fffffff;
                  auVar35._12_4_ = 0x7fffffff;
                  auVar96 = vandps_avx512vl(ZEXT416((uint)fVar252),auVar35);
                  if (auVar96._0_4_ < auVar95._0_4_) {
                    fVar288 = auVar94._0_4_ + (float)local_950._0_4_;
                    if ((fVar288 < fVar184) ||
                       (fVar289 = *(float *)(ray + k * 4 + 0x200), fVar289 < fVar288)) break;
                    auVar95 = vmovshdup_avx(auVar94);
                    fVar290 = auVar95._0_4_;
                    if ((fVar290 < 0.0) || (1.0 < fVar290)) break;
                    auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a40._0_4_));
                    fVar252 = auVar95._0_4_;
                    fVar251 = local_a40._0_4_ * -0.5;
                    auVar270 = ZEXT464((uint)fVar251);
                    pGVar3 = (context->scene->geometries).items[uVar77].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    fVar251 = fVar252 * 1.5 + fVar251 * fVar252 * fVar252 * fVar252;
                    auVar249._0_4_ = auVar23._0_4_ * fVar251;
                    auVar249._4_4_ = auVar23._4_4_ * fVar251;
                    auVar249._8_4_ = auVar23._8_4_ * fVar251;
                    auVar249._12_4_ = auVar23._12_4_ * fVar251;
                    auVar97 = vfmadd213ps_fma(auVar97,auVar249,auVar93);
                    auVar95 = vshufps_avx(auVar249,auVar249,0xc9);
                    auVar96 = vshufps_avx(auVar93,auVar93,0xc9);
                    auVar250._0_4_ = auVar249._0_4_ * auVar96._0_4_;
                    auVar250._4_4_ = auVar249._4_4_ * auVar96._4_4_;
                    auVar250._8_4_ = auVar249._8_4_ * auVar96._8_4_;
                    auVar250._12_4_ = auVar249._12_4_ * auVar96._12_4_;
                    auVar101 = vfmsub231ps_fma(auVar250,auVar93,auVar95);
                    auVar95 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar96 = vshufps_avx(auVar97,auVar97,0xc9);
                    auVar270 = ZEXT1664(auVar96);
                    auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                    auVar208._0_4_ = auVar97._0_4_ * auVar101._0_4_;
                    auVar208._4_4_ = auVar97._4_4_ * auVar101._4_4_;
                    auVar208._8_4_ = auVar97._8_4_ * auVar101._8_4_;
                    auVar208._12_4_ = auVar97._12_4_ * auVar101._12_4_;
                    auVar95 = vfmsub231ps_fma(auVar208,auVar95,auVar96);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar288;
                      uVar191 = vextractps_avx(auVar95,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar191;
                      uVar191 = vextractps_avx(auVar95,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar191;
                      *(int *)(ray + k * 4 + 0x380) = auVar95._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar290;
                      *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                      *(int *)(ray + k * 4 + 0x440) = (int)local_a48;
                      *(uint *)(ray + k * 4 + 0x480) = uVar77;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar7 = context->user;
                    auVar183 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar183,auVar292);
                    auVar183 = vpermps_avx512f(auVar183,ZEXT1664(auVar95));
                    auVar156 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar156,ZEXT1664(auVar95));
                    local_380 = vbroadcastss_avx512f(auVar95);
                    local_400[0] = (RTCHitN)auVar183[0];
                    local_400[1] = (RTCHitN)auVar183[1];
                    local_400[2] = (RTCHitN)auVar183[2];
                    local_400[3] = (RTCHitN)auVar183[3];
                    local_400[4] = (RTCHitN)auVar183[4];
                    local_400[5] = (RTCHitN)auVar183[5];
                    local_400[6] = (RTCHitN)auVar183[6];
                    local_400[7] = (RTCHitN)auVar183[7];
                    local_400[8] = (RTCHitN)auVar183[8];
                    local_400[9] = (RTCHitN)auVar183[9];
                    local_400[10] = (RTCHitN)auVar183[10];
                    local_400[0xb] = (RTCHitN)auVar183[0xb];
                    local_400[0xc] = (RTCHitN)auVar183[0xc];
                    local_400[0xd] = (RTCHitN)auVar183[0xd];
                    local_400[0xe] = (RTCHitN)auVar183[0xe];
                    local_400[0xf] = (RTCHitN)auVar183[0xf];
                    local_400[0x10] = (RTCHitN)auVar183[0x10];
                    local_400[0x11] = (RTCHitN)auVar183[0x11];
                    local_400[0x12] = (RTCHitN)auVar183[0x12];
                    local_400[0x13] = (RTCHitN)auVar183[0x13];
                    local_400[0x14] = (RTCHitN)auVar183[0x14];
                    local_400[0x15] = (RTCHitN)auVar183[0x15];
                    local_400[0x16] = (RTCHitN)auVar183[0x16];
                    local_400[0x17] = (RTCHitN)auVar183[0x17];
                    local_400[0x18] = (RTCHitN)auVar183[0x18];
                    local_400[0x19] = (RTCHitN)auVar183[0x19];
                    local_400[0x1a] = (RTCHitN)auVar183[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar183[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar183[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar183[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar183[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar183[0x1f];
                    local_400[0x20] = (RTCHitN)auVar183[0x20];
                    local_400[0x21] = (RTCHitN)auVar183[0x21];
                    local_400[0x22] = (RTCHitN)auVar183[0x22];
                    local_400[0x23] = (RTCHitN)auVar183[0x23];
                    local_400[0x24] = (RTCHitN)auVar183[0x24];
                    local_400[0x25] = (RTCHitN)auVar183[0x25];
                    local_400[0x26] = (RTCHitN)auVar183[0x26];
                    local_400[0x27] = (RTCHitN)auVar183[0x27];
                    local_400[0x28] = (RTCHitN)auVar183[0x28];
                    local_400[0x29] = (RTCHitN)auVar183[0x29];
                    local_400[0x2a] = (RTCHitN)auVar183[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar183[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar183[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar183[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar183[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar183[0x2f];
                    local_400[0x30] = (RTCHitN)auVar183[0x30];
                    local_400[0x31] = (RTCHitN)auVar183[0x31];
                    local_400[0x32] = (RTCHitN)auVar183[0x32];
                    local_400[0x33] = (RTCHitN)auVar183[0x33];
                    local_400[0x34] = (RTCHitN)auVar183[0x34];
                    local_400[0x35] = (RTCHitN)auVar183[0x35];
                    local_400[0x36] = (RTCHitN)auVar183[0x36];
                    local_400[0x37] = (RTCHitN)auVar183[0x37];
                    local_400[0x38] = (RTCHitN)auVar183[0x38];
                    local_400[0x39] = (RTCHitN)auVar183[0x39];
                    local_400[0x3a] = (RTCHitN)auVar183[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar183[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar183[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar183[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar183[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar183[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar183 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar183);
                    auVar115 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                    local_a50[3] = auVar115;
                    local_a50[2] = auVar115;
                    local_a50[1] = auVar115;
                    *local_a50 = auVar115;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar7->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar7->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar288;
                    auVar183 = vmovdqa64_avx512f(local_4c0);
                    local_780 = vmovdqa64_avx512f(auVar183);
                    local_b90.valid = (int *)local_780;
                    local_b90.geometryUserPtr = pGVar3->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = local_400;
                    local_b90.N = 0x10;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar270 = ZEXT1664(auVar96);
                      auVar282 = ZEXT1664(auVar280);
                      auVar287 = ZEXT1664(auVar286);
                      auVar292 = ZEXT1664(auVar94);
                      auVar293 = ZEXT1664(auVar23);
                      auVar295 = ZEXT1664(local_a40._0_16_);
                      auVar300 = ZEXT1664(auVar93);
                      (*pGVar3->intersectionFilterN)(&local_b90);
                      auVar308 = ZEXT3264(local_b60);
                      auVar307 = ZEXT3264(local_b40);
                      auVar306 = ZEXT3264(local_b20);
                      auVar305 = ZEXT3264(local_b00);
                      auVar304 = ZEXT3264(local_ae0);
                      auVar183 = vmovdqa64_avx512f(local_780);
                    }
                    uVar24 = vptestmd_avx512f(auVar183,auVar183);
                    if ((short)uVar24 != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar287 = ZEXT1664(auVar287._0_16_);
                        auVar292 = ZEXT1664(auVar292._0_16_);
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        auVar295 = ZEXT1664(auVar295._0_16_);
                        auVar300 = ZEXT1664(auVar300._0_16_);
                        (*p_Var8)(&local_b90);
                        auVar308 = ZEXT3264(local_b60);
                        auVar307 = ZEXT3264(local_b40);
                        auVar306 = ZEXT3264(local_b20);
                        auVar305 = ZEXT3264(local_b00);
                        auVar304 = ZEXT3264(local_ae0);
                        auVar183 = vmovdqa64_avx512f(local_780);
                      }
                      uVar85 = vptestmd_avx512f(auVar183,auVar183);
                      if ((short)uVar85 != 0) {
                        iVar56 = *(int *)(local_b90.hit + 4);
                        iVar57 = *(int *)(local_b90.hit + 8);
                        iVar58 = *(int *)(local_b90.hit + 0xc);
                        iVar59 = *(int *)(local_b90.hit + 0x10);
                        iVar60 = *(int *)(local_b90.hit + 0x14);
                        iVar61 = *(int *)(local_b90.hit + 0x18);
                        iVar62 = *(int *)(local_b90.hit + 0x1c);
                        iVar63 = *(int *)(local_b90.hit + 0x20);
                        iVar64 = *(int *)(local_b90.hit + 0x24);
                        iVar65 = *(int *)(local_b90.hit + 0x28);
                        iVar66 = *(int *)(local_b90.hit + 0x2c);
                        iVar67 = *(int *)(local_b90.hit + 0x30);
                        iVar68 = *(int *)(local_b90.hit + 0x34);
                        iVar69 = *(int *)(local_b90.hit + 0x38);
                        iVar70 = *(int *)(local_b90.hit + 0x3c);
                        bVar83 = (byte)uVar85;
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar76 = (byte)(uVar85 >> 8);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x300) =
                             (uint)(bVar83 & 1) * *(int *)local_b90.hit |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_b90.ray + 0x300);
                        *(uint *)(local_b90.ray + 0x304) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x304);
                        *(uint *)(local_b90.ray + 0x308) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x308)
                        ;
                        *(uint *)(local_b90.ray + 0x30c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x30c)
                        ;
                        *(uint *)(local_b90.ray + 0x310) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x310)
                        ;
                        *(uint *)(local_b90.ray + 0x314) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x314)
                        ;
                        *(uint *)(local_b90.ray + 0x318) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x318)
                        ;
                        *(uint *)(local_b90.ray + 0x31c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x31c)
                        ;
                        *(uint *)(local_b90.ray + 800) =
                             (uint)(bVar76 & 1) * iVar63 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 800);
                        *(uint *)(local_b90.ray + 0x324) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x324)
                        ;
                        *(uint *)(local_b90.ray + 0x328) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x328)
                        ;
                        *(uint *)(local_b90.ray + 0x32c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x32c)
                        ;
                        *(uint *)(local_b90.ray + 0x330) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x330)
                        ;
                        *(uint *)(local_b90.ray + 0x334) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x334)
                        ;
                        *(uint *)(local_b90.ray + 0x338) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x338)
                        ;
                        *(uint *)(local_b90.ray + 0x33c) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x33c)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0x44);
                        iVar57 = *(int *)(local_b90.hit + 0x48);
                        iVar58 = *(int *)(local_b90.hit + 0x4c);
                        iVar59 = *(int *)(local_b90.hit + 0x50);
                        iVar60 = *(int *)(local_b90.hit + 0x54);
                        iVar61 = *(int *)(local_b90.hit + 0x58);
                        iVar62 = *(int *)(local_b90.hit + 0x5c);
                        iVar63 = *(int *)(local_b90.hit + 0x60);
                        iVar64 = *(int *)(local_b90.hit + 100);
                        iVar65 = *(int *)(local_b90.hit + 0x68);
                        iVar66 = *(int *)(local_b90.hit + 0x6c);
                        iVar67 = *(int *)(local_b90.hit + 0x70);
                        iVar68 = *(int *)(local_b90.hit + 0x74);
                        iVar69 = *(int *)(local_b90.hit + 0x78);
                        iVar70 = *(int *)(local_b90.hit + 0x7c);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x340) =
                             (uint)(bVar83 & 1) * *(int *)(local_b90.hit + 0x40) |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_b90.ray + 0x340);
                        *(uint *)(local_b90.ray + 0x344) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x344);
                        *(uint *)(local_b90.ray + 0x348) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x348)
                        ;
                        *(uint *)(local_b90.ray + 0x34c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x34c)
                        ;
                        *(uint *)(local_b90.ray + 0x350) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x350)
                        ;
                        *(uint *)(local_b90.ray + 0x354) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x354)
                        ;
                        *(uint *)(local_b90.ray + 0x358) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x358)
                        ;
                        *(uint *)(local_b90.ray + 0x35c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x35c)
                        ;
                        *(uint *)(local_b90.ray + 0x360) =
                             (uint)(bVar76 & 1) * iVar63 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x360);
                        *(uint *)(local_b90.ray + 0x364) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x364)
                        ;
                        *(uint *)(local_b90.ray + 0x368) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x368)
                        ;
                        *(uint *)(local_b90.ray + 0x36c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x36c)
                        ;
                        *(uint *)(local_b90.ray + 0x370) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x370)
                        ;
                        *(uint *)(local_b90.ray + 0x374) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x374)
                        ;
                        *(uint *)(local_b90.ray + 0x378) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x378)
                        ;
                        *(uint *)(local_b90.ray + 0x37c) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x37c)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0x84);
                        iVar57 = *(int *)(local_b90.hit + 0x88);
                        iVar58 = *(int *)(local_b90.hit + 0x8c);
                        iVar59 = *(int *)(local_b90.hit + 0x90);
                        iVar60 = *(int *)(local_b90.hit + 0x94);
                        iVar61 = *(int *)(local_b90.hit + 0x98);
                        iVar62 = *(int *)(local_b90.hit + 0x9c);
                        iVar63 = *(int *)(local_b90.hit + 0xa0);
                        iVar64 = *(int *)(local_b90.hit + 0xa4);
                        iVar65 = *(int *)(local_b90.hit + 0xa8);
                        iVar66 = *(int *)(local_b90.hit + 0xac);
                        iVar67 = *(int *)(local_b90.hit + 0xb0);
                        iVar68 = *(int *)(local_b90.hit + 0xb4);
                        iVar69 = *(int *)(local_b90.hit + 0xb8);
                        iVar70 = *(int *)(local_b90.hit + 0xbc);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x380) =
                             (uint)(bVar83 & 1) * *(int *)(local_b90.hit + 0x80) |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_b90.ray + 0x380);
                        *(uint *)(local_b90.ray + 900) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 900);
                        *(uint *)(local_b90.ray + 0x388) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x388)
                        ;
                        *(uint *)(local_b90.ray + 0x38c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x38c)
                        ;
                        *(uint *)(local_b90.ray + 0x390) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x390)
                        ;
                        *(uint *)(local_b90.ray + 0x394) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x394)
                        ;
                        *(uint *)(local_b90.ray + 0x398) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x398)
                        ;
                        *(uint *)(local_b90.ray + 0x39c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x39c)
                        ;
                        *(uint *)(local_b90.ray + 0x3a0) =
                             (uint)(bVar76 & 1) * iVar63 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x3a0);
                        *(uint *)(local_b90.ray + 0x3a4) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3a4)
                        ;
                        *(uint *)(local_b90.ray + 0x3a8) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x3a8)
                        ;
                        *(uint *)(local_b90.ray + 0x3ac) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3ac)
                        ;
                        *(uint *)(local_b90.ray + 0x3b0) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3b0)
                        ;
                        *(uint *)(local_b90.ray + 0x3b4) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x3b4)
                        ;
                        *(uint *)(local_b90.ray + 0x3b8) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x3b8)
                        ;
                        *(uint *)(local_b90.ray + 0x3bc) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x3bc)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0xc4);
                        iVar57 = *(int *)(local_b90.hit + 200);
                        iVar58 = *(int *)(local_b90.hit + 0xcc);
                        iVar59 = *(int *)(local_b90.hit + 0xd0);
                        iVar60 = *(int *)(local_b90.hit + 0xd4);
                        iVar61 = *(int *)(local_b90.hit + 0xd8);
                        iVar62 = *(int *)(local_b90.hit + 0xdc);
                        iVar63 = *(int *)(local_b90.hit + 0xe0);
                        iVar64 = *(int *)(local_b90.hit + 0xe4);
                        iVar65 = *(int *)(local_b90.hit + 0xe8);
                        iVar66 = *(int *)(local_b90.hit + 0xec);
                        iVar67 = *(int *)(local_b90.hit + 0xf0);
                        iVar68 = *(int *)(local_b90.hit + 0xf4);
                        iVar69 = *(int *)(local_b90.hit + 0xf8);
                        iVar70 = *(int *)(local_b90.hit + 0xfc);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x3c0) =
                             (uint)(bVar83 & 1) * *(int *)(local_b90.hit + 0xc0) |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_b90.ray + 0x3c0);
                        *(uint *)(local_b90.ray + 0x3c4) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x3c4);
                        *(uint *)(local_b90.ray + 0x3c8) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x3c8)
                        ;
                        *(uint *)(local_b90.ray + 0x3cc) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x3cc)
                        ;
                        *(uint *)(local_b90.ray + 0x3d0) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x3d0)
                        ;
                        *(uint *)(local_b90.ray + 0x3d4) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x3d4)
                        ;
                        *(uint *)(local_b90.ray + 0x3d8) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x3d8)
                        ;
                        *(uint *)(local_b90.ray + 0x3dc) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x3dc)
                        ;
                        *(uint *)(local_b90.ray + 0x3e0) =
                             (uint)(bVar76 & 1) * iVar63 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x3e0);
                        *(uint *)(local_b90.ray + 0x3e4) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3e4)
                        ;
                        *(uint *)(local_b90.ray + 1000) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 1000);
                        *(uint *)(local_b90.ray + 0x3ec) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3ec)
                        ;
                        *(uint *)(local_b90.ray + 0x3f0) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3f0)
                        ;
                        *(uint *)(local_b90.ray + 0x3f4) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x3f4)
                        ;
                        *(uint *)(local_b90.ray + 0x3f8) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x3f8)
                        ;
                        *(uint *)(local_b90.ray + 0x3fc) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x3fc)
                        ;
                        iVar56 = *(int *)(local_b90.hit + 0x104);
                        iVar57 = *(int *)(local_b90.hit + 0x108);
                        iVar58 = *(int *)(local_b90.hit + 0x10c);
                        iVar59 = *(int *)(local_b90.hit + 0x110);
                        iVar60 = *(int *)(local_b90.hit + 0x114);
                        iVar61 = *(int *)(local_b90.hit + 0x118);
                        iVar62 = *(int *)(local_b90.hit + 0x11c);
                        iVar63 = *(int *)(local_b90.hit + 0x120);
                        iVar64 = *(int *)(local_b90.hit + 0x124);
                        iVar65 = *(int *)(local_b90.hit + 0x128);
                        iVar66 = *(int *)(local_b90.hit + 300);
                        iVar67 = *(int *)(local_b90.hit + 0x130);
                        iVar68 = *(int *)(local_b90.hit + 0x134);
                        iVar69 = *(int *)(local_b90.hit + 0x138);
                        iVar70 = *(int *)(local_b90.hit + 0x13c);
                        bVar9 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar22 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_b90.ray + 0x400) =
                             (uint)(bVar83 & 1) * *(int *)(local_b90.hit + 0x100) |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_b90.ray + 0x400);
                        *(uint *)(local_b90.ray + 0x404) =
                             (uint)bVar9 * iVar56 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x404);
                        *(uint *)(local_b90.ray + 0x408) =
                             (uint)bVar10 * iVar57 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x408)
                        ;
                        *(uint *)(local_b90.ray + 0x40c) =
                             (uint)bVar11 * iVar58 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x40c)
                        ;
                        *(uint *)(local_b90.ray + 0x410) =
                             (uint)bVar12 * iVar59 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x410)
                        ;
                        *(uint *)(local_b90.ray + 0x414) =
                             (uint)bVar13 * iVar60 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x414)
                        ;
                        *(uint *)(local_b90.ray + 0x418) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x418)
                        ;
                        *(uint *)(local_b90.ray + 0x41c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x41c)
                        ;
                        *(uint *)(local_b90.ray + 0x420) =
                             (uint)(bVar76 & 1) * iVar63 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x420);
                        *(uint *)(local_b90.ray + 0x424) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x424)
                        ;
                        *(uint *)(local_b90.ray + 0x428) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x428)
                        ;
                        *(uint *)(local_b90.ray + 0x42c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x42c)
                        ;
                        *(uint *)(local_b90.ray + 0x430) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x430)
                        ;
                        *(uint *)(local_b90.ray + 0x434) =
                             (uint)bVar20 * iVar68 | (uint)!bVar20 * *(int *)(local_b90.ray + 0x434)
                        ;
                        *(uint *)(local_b90.ray + 0x438) =
                             (uint)bVar21 * iVar69 | (uint)!bVar21 * *(int *)(local_b90.ray + 0x438)
                        ;
                        *(uint *)(local_b90.ray + 0x43c) =
                             (uint)bVar22 * iVar70 | (uint)!bVar22 * *(int *)(local_b90.ray + 0x43c)
                        ;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x140));
                        auVar183 = vmovdqu32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x180));
                        auVar183 = vmovdqu32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x1c0));
                        auVar183 = vmovdqa32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x200));
                        auVar183 = vmovdqa32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar183;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar289;
                    break;
                  }
                }
                lVar84 = lVar84 + -1;
              } while (lVar84 != 0);
              uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar180._4_4_ = uVar191;
              auVar180._0_4_ = uVar191;
              auVar180._8_4_ = uVar191;
              auVar180._12_4_ = uVar191;
              auVar180._16_4_ = uVar191;
              auVar180._20_4_ = uVar191;
              auVar180._24_4_ = uVar191;
              auVar180._28_4_ = uVar191;
              auVar72._4_4_ = fStack_6fc;
              auVar72._0_4_ = local_700;
              auVar72._8_4_ = fStack_6f8;
              auVar72._12_4_ = fStack_6f4;
              auVar72._16_4_ = fStack_6f0;
              auVar72._20_4_ = fStack_6ec;
              auVar72._24_4_ = fStack_6e8;
              auVar72._28_4_ = fStack_6e4;
              uVar24 = vcmpps_avx512vl(auVar180,auVar72,0xd);
              bVar79 = ~('\x01' << ((byte)iVar28 & 0x1f)) & bVar79 & (byte)uVar24;
            } while (bVar79 != 0);
            auVar152 = local_720;
            fVar283 = (float)local_a00._0_4_;
            fVar288 = (float)local_a00._4_4_;
            fVar289 = fStack_9f8;
            fVar290 = fStack_9f4;
            fVar251 = fStack_9f0;
            fVar252 = fStack_9ec;
            fVar253 = fStack_9e8;
            fVar254 = fStack_9e4;
          }
          uVar26 = vpcmpgtd_avx512vl(auVar152,local_6c0);
          uVar27 = vpcmpd_avx512vl(local_6c0,local_640,1);
          auVar230._0_4_ = fVar283 + (float)local_540._0_4_;
          auVar230._4_4_ = fVar288 + (float)local_540._4_4_;
          auVar230._8_4_ = fVar289 + fStack_538;
          auVar230._12_4_ = fVar290 + fStack_534;
          auVar230._16_4_ = fVar251 + fStack_530;
          auVar230._20_4_ = fVar252 + fStack_52c;
          auVar230._24_4_ = fVar253 + fStack_528;
          auVar230._28_4_ = fVar254 + fStack_524;
          uVar24 = vcmpps_avx512vl(auVar230,auVar180,2);
          bVar80 = bVar80 & (byte)uVar27 & (byte)uVar24;
          auVar231._0_4_ = fVar283 + local_6a0._0_4_;
          auVar231._4_4_ = fVar288 + local_6a0._4_4_;
          auVar231._8_4_ = fVar289 + local_6a0._8_4_;
          auVar231._12_4_ = fVar290 + local_6a0._12_4_;
          auVar231._16_4_ = fVar251 + local_6a0._16_4_;
          auVar231._20_4_ = fVar252 + local_6a0._20_4_;
          auVar231._24_4_ = fVar253 + local_6a0._24_4_;
          auVar231._28_4_ = fVar254 + local_6a0._28_4_;
          uVar24 = vcmpps_avx512vl(auVar231,auVar180,2);
          bVar74 = bVar74 & (byte)uVar26 & (byte)uVar24 | bVar80;
          if (bVar74 != 0) {
            abStack_1a0[uVar78 * 0x60] = bVar74;
            auVar154._0_4_ =
                 (uint)(bVar80 & 1) * local_540._0_4_ |
                 (uint)!(bool)(bVar80 & 1) * (int)local_6a0._0_4_;
            bVar9 = (bool)(bVar80 >> 1 & 1);
            auVar154._4_4_ = (uint)bVar9 * local_540._4_4_ | (uint)!bVar9 * (int)local_6a0._4_4_;
            bVar9 = (bool)(bVar80 >> 2 & 1);
            auVar154._8_4_ = (uint)bVar9 * (int)fStack_538 | (uint)!bVar9 * (int)local_6a0._8_4_;
            bVar9 = (bool)(bVar80 >> 3 & 1);
            auVar154._12_4_ = (uint)bVar9 * (int)fStack_534 | (uint)!bVar9 * (int)local_6a0._12_4_;
            bVar9 = (bool)(bVar80 >> 4 & 1);
            auVar154._16_4_ = (uint)bVar9 * (int)fStack_530 | (uint)!bVar9 * (int)local_6a0._16_4_;
            bVar9 = (bool)(bVar80 >> 5 & 1);
            auVar154._20_4_ = (uint)bVar9 * (int)fStack_52c | (uint)!bVar9 * (int)local_6a0._20_4_;
            auVar154._24_4_ =
                 (uint)(bVar80 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar80 >> 6) * (int)local_6a0._24_4_;
            auVar154._28_4_ = local_6a0._28_4_;
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar154;
            uVar85 = vmovlps_avx(local_6d0);
            (&uStack_160)[uVar78 * 0xc] = uVar85;
            aiStack_158[uVar78 * 0x18] = iVar81 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
        }
      }
    }
    do {
      uVar87 = (uint)uVar78;
      uVar78 = (ulong)(uVar87 - 1);
      if (uVar87 == 0) {
        uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar36._4_4_ = uVar191;
        auVar36._0_4_ = uVar191;
        auVar36._8_4_ = uVar191;
        auVar36._12_4_ = uVar191;
        uVar24 = vcmpps_avx512vl(local_6e0,auVar36,2);
        uVar77 = (uint)uVar24 & (uint)local_8e8 - 1 & (uint)local_8e8;
        local_8e8 = (ulong)uVar77;
        if (uVar77 == 0) {
          return;
        }
        goto LAB_01baa103;
      }
      lVar84 = uVar78 * 0x60;
      auVar115 = *(undefined1 (*) [32])(auStack_180 + lVar84);
      auVar212._0_4_ = fVar283 + auVar115._0_4_;
      auVar212._4_4_ = fVar288 + auVar115._4_4_;
      auVar212._8_4_ = fVar289 + auVar115._8_4_;
      auVar212._12_4_ = fVar290 + auVar115._12_4_;
      auVar212._16_4_ = fVar251 + auVar115._16_4_;
      auVar212._20_4_ = fVar252 + auVar115._20_4_;
      auVar212._24_4_ = fVar253 + auVar115._24_4_;
      auVar212._28_4_ = fVar254 + auVar115._28_4_;
      uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar191;
      auVar41._0_4_ = uVar191;
      auVar41._8_4_ = uVar191;
      auVar41._12_4_ = uVar191;
      auVar41._16_4_ = uVar191;
      auVar41._20_4_ = uVar191;
      auVar41._24_4_ = uVar191;
      auVar41._28_4_ = uVar191;
      uVar24 = vcmpps_avx512vl(auVar212,auVar41,2);
      uVar86 = (uint)uVar24 & (uint)abStack_1a0[lVar84];
    } while (uVar86 == 0);
    uVar85 = (&uStack_160)[uVar78 * 0xc];
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar85;
    auVar232._8_4_ = 0x7f800000;
    auVar232._0_8_ = 0x7f8000007f800000;
    auVar232._12_4_ = 0x7f800000;
    auVar232._16_4_ = 0x7f800000;
    auVar232._20_4_ = 0x7f800000;
    auVar232._24_4_ = 0x7f800000;
    auVar232._28_4_ = 0x7f800000;
    auVar112 = vblendmps_avx512vl(auVar232,auVar115);
    bVar74 = (byte)uVar86;
    auVar155._0_4_ =
         (uint)(bVar74 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar115._0_4_;
    bVar9 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar155._4_4_ = (uint)bVar9 * auVar112._4_4_ | (uint)!bVar9 * (int)auVar115._4_4_;
    bVar9 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar155._8_4_ = (uint)bVar9 * auVar112._8_4_ | (uint)!bVar9 * (int)auVar115._8_4_;
    bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar155._12_4_ = (uint)bVar9 * auVar112._12_4_ | (uint)!bVar9 * (int)auVar115._12_4_;
    bVar9 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar155._16_4_ = (uint)bVar9 * auVar112._16_4_ | (uint)!bVar9 * (int)auVar115._16_4_;
    bVar9 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar155._20_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * (int)auVar115._20_4_;
    bVar9 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar155._24_4_ = (uint)bVar9 * auVar112._24_4_ | (uint)!bVar9 * (int)auVar115._24_4_;
    auVar155._28_4_ =
         (uVar86 >> 7) * auVar112._28_4_ | (uint)!SUB41(uVar86 >> 7,0) * (int)auVar115._28_4_;
    auVar115 = vshufps_avx(auVar155,auVar155,0xb1);
    auVar115 = vminps_avx(auVar155,auVar115);
    auVar112 = vshufpd_avx(auVar115,auVar115,5);
    auVar115 = vminps_avx(auVar115,auVar112);
    auVar112 = vpermpd_avx2(auVar115,0x4e);
    auVar115 = vminps_avx(auVar115,auVar112);
    uVar24 = vcmpps_avx512vl(auVar155,auVar115,0);
    bVar79 = (byte)uVar24 & bVar74;
    if (bVar79 != 0) {
      uVar86 = (uint)bVar79;
    }
    uVar157 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      uVar157 = uVar157 + 1;
    }
    iVar81 = aiStack_158[uVar78 * 0x18];
    bVar74 = ~('\x01' << ((byte)uVar157 & 0x1f)) & bVar74;
    abStack_1a0[lVar84] = bVar74;
    if (bVar74 == 0) {
      uVar87 = uVar87 - 1;
    }
    uVar191 = (undefined4)uVar85;
    auVar182._4_4_ = uVar191;
    auVar182._0_4_ = uVar191;
    auVar182._8_4_ = uVar191;
    auVar182._12_4_ = uVar191;
    auVar182._16_4_ = uVar191;
    auVar182._20_4_ = uVar191;
    auVar182._24_4_ = uVar191;
    auVar182._28_4_ = uVar191;
    auVar94 = vmovshdup_avx(auVar209);
    auVar94 = vsubps_avx(auVar94,auVar209);
    auVar213._0_4_ = auVar94._0_4_;
    auVar213._4_4_ = auVar213._0_4_;
    auVar213._8_4_ = auVar213._0_4_;
    auVar213._12_4_ = auVar213._0_4_;
    auVar213._16_4_ = auVar213._0_4_;
    auVar213._20_4_ = auVar213._0_4_;
    auVar213._24_4_ = auVar213._0_4_;
    auVar213._28_4_ = auVar213._0_4_;
    auVar94 = vfmadd132ps_fma(auVar213,auVar182,_DAT_01faff20);
    auVar115 = ZEXT1632(auVar94);
    local_400[0] = (RTCHitN)auVar115[0];
    local_400[1] = (RTCHitN)auVar115[1];
    local_400[2] = (RTCHitN)auVar115[2];
    local_400[3] = (RTCHitN)auVar115[3];
    local_400[4] = (RTCHitN)auVar115[4];
    local_400[5] = (RTCHitN)auVar115[5];
    local_400[6] = (RTCHitN)auVar115[6];
    local_400[7] = (RTCHitN)auVar115[7];
    local_400[8] = (RTCHitN)auVar115[8];
    local_400[9] = (RTCHitN)auVar115[9];
    local_400[10] = (RTCHitN)auVar115[10];
    local_400[0xb] = (RTCHitN)auVar115[0xb];
    local_400[0xc] = (RTCHitN)auVar115[0xc];
    local_400[0xd] = (RTCHitN)auVar115[0xd];
    local_400[0xe] = (RTCHitN)auVar115[0xe];
    local_400[0xf] = (RTCHitN)auVar115[0xf];
    local_400[0x10] = (RTCHitN)auVar115[0x10];
    local_400[0x11] = (RTCHitN)auVar115[0x11];
    local_400[0x12] = (RTCHitN)auVar115[0x12];
    local_400[0x13] = (RTCHitN)auVar115[0x13];
    local_400[0x14] = (RTCHitN)auVar115[0x14];
    local_400[0x15] = (RTCHitN)auVar115[0x15];
    local_400[0x16] = (RTCHitN)auVar115[0x16];
    local_400[0x17] = (RTCHitN)auVar115[0x17];
    local_400[0x18] = (RTCHitN)auVar115[0x18];
    local_400[0x19] = (RTCHitN)auVar115[0x19];
    local_400[0x1a] = (RTCHitN)auVar115[0x1a];
    local_400[0x1b] = (RTCHitN)auVar115[0x1b];
    local_400[0x1c] = (RTCHitN)auVar115[0x1c];
    local_400[0x1d] = (RTCHitN)auVar115[0x1d];
    local_400[0x1e] = (RTCHitN)auVar115[0x1e];
    local_400[0x1f] = (RTCHitN)auVar115[0x1f];
    auVar183 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar157 * 4));
    uVar78 = (ulong)uVar87;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }